

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersector1<8>::
     occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  float *pfVar5;
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  int iVar19;
  RTCFilterFunctionN p_Var20;
  undefined1 auVar21 [16];
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  byte bVar97;
  uint uVar98;
  ulong uVar99;
  Geometry *pGVar100;
  Geometry *geometry;
  long lVar101;
  ulong uVar102;
  bool bVar103;
  ulong uVar104;
  undefined4 uVar105;
  float fVar118;
  undefined8 uVar106;
  float fVar119;
  undefined1 auVar107 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar120;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar135;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar169 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar170 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  float fVar175;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  float fVar188;
  undefined1 auVar189 [32];
  float fVar191;
  float fVar192;
  undefined1 in_ZMM10 [64];
  undefined1 auVar190 [64];
  undefined4 uVar193;
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  float fVar200;
  undefined1 in_ZMM12 [64];
  undefined1 auVar199 [64];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar203;
  float fVar207;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  RTCFilterFunctionNArguments args;
  int local_7ac;
  Primitive *local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  ulong local_690;
  Precalculations *local_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined4 local_538;
  float local_534;
  undefined4 local_530;
  undefined4 local_52c;
  undefined4 local_528;
  uint local_524;
  uint local_520;
  ulong local_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [48];
  float local_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  int local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_688 = pre;
  PVar18 = prim[1];
  uVar104 = (ulong)(byte)PVar18;
  fVar135 = *(float *)(prim + uVar104 * 0x19 + 0x12);
  auVar21 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar104 * 0x19 + 6));
  auVar107._0_4_ = fVar135 * auVar21._0_4_;
  auVar107._4_4_ = fVar135 * auVar21._4_4_;
  auVar107._8_4_ = fVar135 * auVar21._8_4_;
  auVar107._12_4_ = fVar135 * auVar21._12_4_;
  auVar169._0_4_ = fVar135 * (ray->dir).field_0.m128[0];
  auVar169._4_4_ = fVar135 * (ray->dir).field_0.m128[1];
  auVar169._8_4_ = fVar135 * (ray->dir).field_0.m128[2];
  auVar169._12_4_ = fVar135 * (ray->dir).field_0.m128[3];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar104 * 4 + 6);
  auVar153 = vpmovsxbd_avx2(auVar21);
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar104 * 5 + 6);
  auVar115 = vpmovsxbd_avx2(auVar10);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar104 * 6 + 6);
  auVar173 = vpmovsxbd_avx2(auVar11);
  auVar173 = vcvtdq2ps_avx(auVar173);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar104 * 0xb + 6);
  auVar163 = vpmovsxbd_avx2(auVar12);
  auVar163 = vcvtdq2ps_avx(auVar163);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar18 * 0xc) + 6);
  auVar129 = vpmovsxbd_avx2(auVar13);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (uint)(byte)PVar18 * 0xc + uVar104 + 6);
  auVar186 = vpmovsxbd_avx2(auVar14);
  auVar186 = vcvtdq2ps_avx(auVar186);
  uVar99 = (ulong)(uint)((int)(uVar104 * 9) * 2);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar99 + 6);
  auVar141 = vpmovsxbd_avx2(auVar15);
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar99 + uVar104 + 6);
  auVar117 = vpmovsxbd_avx2(auVar16);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar196 = ZEXT3264(auVar117);
  uVar99 = (ulong)(uint)((int)(uVar104 * 5) << 2);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar99 + 6);
  auVar176 = vpmovsxbd_avx2(auVar17);
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar204._4_4_ = auVar169._0_4_;
  auVar204._0_4_ = auVar169._0_4_;
  auVar204._8_4_ = auVar169._0_4_;
  auVar204._12_4_ = auVar169._0_4_;
  auVar204._16_4_ = auVar169._0_4_;
  auVar204._20_4_ = auVar169._0_4_;
  auVar204._24_4_ = auVar169._0_4_;
  auVar204._28_4_ = auVar169._0_4_;
  auVar21 = vmovshdup_avx(auVar169);
  uVar106 = auVar21._0_8_;
  auVar208._8_8_ = uVar106;
  auVar208._0_8_ = uVar106;
  auVar208._16_8_ = uVar106;
  auVar208._24_8_ = uVar106;
  auVar21 = vshufps_avx(auVar169,auVar169,0xaa);
  fVar135 = auVar21._0_4_;
  auVar190._0_4_ = fVar135 * auVar173._0_4_;
  fVar118 = auVar21._4_4_;
  auVar190._4_4_ = fVar118 * auVar173._4_4_;
  auVar190._8_4_ = fVar135 * auVar173._8_4_;
  auVar190._12_4_ = fVar118 * auVar173._12_4_;
  auVar190._16_4_ = fVar135 * auVar173._16_4_;
  auVar190._20_4_ = fVar118 * auVar173._20_4_;
  auVar190._28_36_ = in_ZMM12._28_36_;
  auVar190._24_4_ = fVar135 * auVar173._24_4_;
  auVar187._0_4_ = auVar186._0_4_ * fVar135;
  auVar187._4_4_ = auVar186._4_4_ * fVar118;
  auVar187._8_4_ = auVar186._8_4_ * fVar135;
  auVar187._12_4_ = auVar186._12_4_ * fVar118;
  auVar187._16_4_ = auVar186._16_4_ * fVar135;
  auVar187._20_4_ = auVar186._20_4_ * fVar118;
  auVar187._28_36_ = in_ZMM10._28_36_;
  auVar187._24_4_ = auVar186._24_4_ * fVar135;
  auVar183._0_4_ = auVar176._0_4_ * fVar135;
  auVar183._4_4_ = auVar176._4_4_ * fVar118;
  auVar183._8_4_ = auVar176._8_4_ * fVar135;
  auVar183._12_4_ = auVar176._12_4_ * fVar118;
  auVar183._16_4_ = auVar176._16_4_ * fVar135;
  auVar183._20_4_ = auVar176._20_4_ * fVar118;
  auVar183._24_4_ = auVar176._24_4_ * fVar135;
  auVar183._28_4_ = 0;
  auVar21 = vfmadd231ps_fma(auVar190._0_32_,auVar208,auVar115);
  auVar10 = vfmadd231ps_fma(auVar187._0_32_,auVar208,auVar129);
  auVar11 = vfmadd231ps_fma(auVar183,auVar117,auVar208);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar204,auVar153);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar204,auVar163);
  auVar190 = ZEXT1664(auVar10);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar141,auVar204);
  auVar205._4_4_ = auVar107._0_4_;
  auVar205._0_4_ = auVar107._0_4_;
  auVar205._8_4_ = auVar107._0_4_;
  auVar205._12_4_ = auVar107._0_4_;
  auVar205._16_4_ = auVar107._0_4_;
  auVar205._20_4_ = auVar107._0_4_;
  auVar205._24_4_ = auVar107._0_4_;
  auVar205._28_4_ = auVar107._0_4_;
  auVar21 = vmovshdup_avx(auVar107);
  uVar106 = auVar21._0_8_;
  auVar209._8_8_ = uVar106;
  auVar209._0_8_ = uVar106;
  auVar209._16_8_ = uVar106;
  auVar209._24_8_ = uVar106;
  auVar21 = vshufps_avx(auVar107,auVar107,0xaa);
  fVar135 = auVar21._0_4_;
  auVar171._0_4_ = fVar135 * auVar173._0_4_;
  fVar118 = auVar21._4_4_;
  auVar171._4_4_ = fVar118 * auVar173._4_4_;
  auVar171._8_4_ = fVar135 * auVar173._8_4_;
  auVar171._12_4_ = fVar118 * auVar173._12_4_;
  auVar171._16_4_ = fVar135 * auVar173._16_4_;
  auVar171._20_4_ = fVar118 * auVar173._20_4_;
  auVar171._24_4_ = fVar135 * auVar173._24_4_;
  auVar171._28_4_ = 0;
  auVar131._4_4_ = auVar186._4_4_ * fVar118;
  auVar131._0_4_ = auVar186._0_4_ * fVar135;
  auVar131._8_4_ = auVar186._8_4_ * fVar135;
  auVar131._12_4_ = auVar186._12_4_ * fVar118;
  auVar131._16_4_ = auVar186._16_4_ * fVar135;
  auVar131._20_4_ = auVar186._20_4_ * fVar118;
  auVar131._24_4_ = auVar186._24_4_ * fVar135;
  auVar131._28_4_ = auVar173._28_4_;
  auVar173._4_4_ = auVar176._4_4_ * fVar118;
  auVar173._0_4_ = auVar176._0_4_ * fVar135;
  auVar173._8_4_ = auVar176._8_4_ * fVar135;
  auVar173._12_4_ = auVar176._12_4_ * fVar118;
  auVar173._16_4_ = auVar176._16_4_ * fVar135;
  auVar173._20_4_ = auVar176._20_4_ * fVar118;
  auVar173._24_4_ = auVar176._24_4_ * fVar135;
  auVar173._28_4_ = fVar118;
  auVar21 = vfmadd231ps_fma(auVar171,auVar209,auVar115);
  auVar13 = vfmadd231ps_fma(auVar131,auVar209,auVar129);
  auVar14 = vfmadd231ps_fma(auVar173,auVar209,auVar117);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar205,auVar153);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar205,auVar163);
  local_280._8_4_ = 0x7fffffff;
  local_280._0_8_ = 0x7fffffff7fffffff;
  local_280._12_4_ = 0x7fffffff;
  local_280._16_4_ = 0x7fffffff;
  local_280._20_4_ = 0x7fffffff;
  local_280._24_4_ = 0x7fffffff;
  local_280._28_4_ = 0x7fffffff;
  auVar124._8_4_ = 0x219392ef;
  auVar124._0_8_ = 0x219392ef219392ef;
  auVar124._12_4_ = 0x219392ef;
  auVar124._16_4_ = 0x219392ef;
  auVar124._20_4_ = 0x219392ef;
  auVar124._24_4_ = 0x219392ef;
  auVar124._28_4_ = 0x219392ef;
  auVar153 = vandps_avx(ZEXT1632(auVar12),local_280);
  auVar153 = vcmpps_avx(auVar153,auVar124,1);
  auVar115 = vblendvps_avx(ZEXT1632(auVar12),auVar124,auVar153);
  auVar153 = vandps_avx(ZEXT1632(auVar10),local_280);
  auVar153 = vcmpps_avx(auVar153,auVar124,1);
  auVar173 = vblendvps_avx(ZEXT1632(auVar10),auVar124,auVar153);
  auVar153 = vandps_avx(ZEXT1632(auVar11),local_280);
  auVar153 = vcmpps_avx(auVar153,auVar124,1);
  auVar153 = vblendvps_avx(ZEXT1632(auVar11),auVar124,auVar153);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar205,auVar141);
  auVar163 = vrcpps_avx(auVar115);
  auVar159._8_4_ = 0x3f800000;
  auVar159._0_8_ = 0x3f8000003f800000;
  auVar159._12_4_ = 0x3f800000;
  auVar159._16_4_ = 0x3f800000;
  auVar159._20_4_ = 0x3f800000;
  auVar159._24_4_ = 0x3f800000;
  auVar159._28_4_ = 0x3f800000;
  auVar21 = vfnmadd213ps_fma(auVar115,auVar163,auVar159);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar163,auVar163);
  auVar115 = vrcpps_avx(auVar173);
  auVar10 = vfnmadd213ps_fma(auVar173,auVar115,auVar159);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar115,auVar115);
  auVar115 = vrcpps_avx(auVar153);
  auVar11 = vfnmadd213ps_fma(auVar153,auVar115,auVar159);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar115,auVar115);
  auVar153 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 7 + 6));
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar153 = vsubps_avx(auVar153,ZEXT1632(auVar15));
  auVar163._4_4_ = auVar21._4_4_ * auVar153._4_4_;
  auVar163._0_4_ = auVar21._0_4_ * auVar153._0_4_;
  auVar163._8_4_ = auVar21._8_4_ * auVar153._8_4_;
  auVar163._12_4_ = auVar21._12_4_ * auVar153._12_4_;
  auVar163._16_4_ = auVar153._16_4_ * 0.0;
  auVar163._20_4_ = auVar153._20_4_ * 0.0;
  auVar163._24_4_ = auVar153._24_4_ * 0.0;
  auVar163._28_4_ = auVar153._28_4_;
  auVar153 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 9 + 6));
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar153 = vsubps_avx(auVar153,ZEXT1632(auVar15));
  auVar129._4_4_ = auVar21._4_4_ * auVar153._4_4_;
  auVar129._0_4_ = auVar21._0_4_ * auVar153._0_4_;
  auVar129._8_4_ = auVar21._8_4_ * auVar153._8_4_;
  auVar129._12_4_ = auVar21._12_4_ * auVar153._12_4_;
  auVar129._16_4_ = auVar153._16_4_ * 0.0;
  auVar129._20_4_ = auVar153._20_4_ * 0.0;
  auVar129._24_4_ = auVar153._24_4_ * 0.0;
  auVar129._28_4_ = auVar153._28_4_;
  auVar109._1_3_ = 0;
  auVar109[0] = PVar18;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar18 * 0x10 + 6));
  auVar153 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar18 * 0x10 + uVar104 * -2 + 6));
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar153 = vsubps_avx(auVar153,ZEXT1632(auVar13));
  auVar186._4_4_ = auVar153._4_4_ * auVar10._4_4_;
  auVar186._0_4_ = auVar153._0_4_ * auVar10._0_4_;
  auVar186._8_4_ = auVar153._8_4_ * auVar10._8_4_;
  auVar186._12_4_ = auVar153._12_4_ * auVar10._12_4_;
  auVar186._16_4_ = auVar153._16_4_ * 0.0;
  auVar186._20_4_ = auVar153._20_4_ * 0.0;
  auVar186._24_4_ = auVar153._24_4_ * 0.0;
  auVar186._28_4_ = auVar153._28_4_;
  auVar153 = vcvtdq2ps_avx(auVar115);
  auVar153 = vsubps_avx(auVar153,ZEXT1632(auVar13));
  auVar141._4_4_ = auVar10._4_4_ * auVar153._4_4_;
  auVar141._0_4_ = auVar10._0_4_ * auVar153._0_4_;
  auVar141._8_4_ = auVar10._8_4_ * auVar153._8_4_;
  auVar141._12_4_ = auVar10._12_4_ * auVar153._12_4_;
  auVar141._16_4_ = auVar153._16_4_ * 0.0;
  auVar141._20_4_ = auVar153._20_4_ * 0.0;
  auVar141._24_4_ = auVar153._24_4_ * 0.0;
  auVar141._28_4_ = auVar153._28_4_;
  auVar153 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 + uVar104 + 6));
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar153 = vsubps_avx(auVar153,ZEXT1632(auVar12));
  auVar117._4_4_ = auVar153._4_4_ * auVar11._4_4_;
  auVar117._0_4_ = auVar153._0_4_ * auVar11._0_4_;
  auVar117._8_4_ = auVar153._8_4_ * auVar11._8_4_;
  auVar117._12_4_ = auVar153._12_4_ * auVar11._12_4_;
  auVar117._16_4_ = auVar153._16_4_ * 0.0;
  auVar117._20_4_ = auVar153._20_4_ * 0.0;
  auVar117._24_4_ = auVar153._24_4_ * 0.0;
  auVar117._28_4_ = auVar153._28_4_;
  auVar153 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0x17 + 6));
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar153 = vsubps_avx(auVar153,ZEXT1632(auVar12));
  auVar176._4_4_ = auVar11._4_4_ * auVar153._4_4_;
  auVar176._0_4_ = auVar11._0_4_ * auVar153._0_4_;
  auVar176._8_4_ = auVar11._8_4_ * auVar153._8_4_;
  auVar176._12_4_ = auVar11._12_4_ * auVar153._12_4_;
  auVar176._16_4_ = auVar153._16_4_ * 0.0;
  auVar176._20_4_ = auVar153._20_4_ * 0.0;
  auVar176._24_4_ = auVar153._24_4_ * 0.0;
  auVar176._28_4_ = auVar153._28_4_;
  auVar153 = vpminsd_avx2(auVar163,auVar129);
  auVar115 = vpminsd_avx2(auVar186,auVar141);
  auVar153 = vmaxps_avx(auVar153,auVar115);
  uVar105 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar172._4_4_ = uVar105;
  auVar172._0_4_ = uVar105;
  auVar172._8_4_ = uVar105;
  auVar172._12_4_ = uVar105;
  auVar172._16_4_ = uVar105;
  auVar172._20_4_ = uVar105;
  auVar172._24_4_ = uVar105;
  auVar172._28_4_ = uVar105;
  auVar115 = vpminsd_avx2(auVar117,auVar176);
  auVar115 = vmaxps_avx(auVar115,auVar172);
  auVar187 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                CONCAT424(0x3f7ffffa,
                                          CONCAT420(0x3f7ffffa,
                                                    CONCAT416(0x3f7ffffa,
                                                              CONCAT412(0x3f7ffffa,
                                                                        CONCAT48(0x3f7ffffa,
                                                                                 0x3f7ffffa3f7ffffa)
                                                                       ))))));
  auVar153 = vmaxps_avx(auVar153,auVar115);
  local_80._4_4_ = auVar153._4_4_ * 0.99999964;
  local_80._0_4_ = auVar153._0_4_ * 0.99999964;
  local_80._8_4_ = auVar153._8_4_ * 0.99999964;
  local_80._12_4_ = auVar153._12_4_ * 0.99999964;
  local_80._16_4_ = auVar153._16_4_ * 0.99999964;
  local_80._20_4_ = auVar153._20_4_ * 0.99999964;
  local_80._24_4_ = auVar153._24_4_ * 0.99999964;
  local_80._28_4_ = auVar115._28_4_;
  auVar153 = vpmaxsd_avx2(auVar163,auVar129);
  auVar115 = vpmaxsd_avx2(auVar186,auVar141);
  auVar153 = vminps_avx(auVar153,auVar115);
  auVar115 = vpmaxsd_avx2(auVar117,auVar176);
  fVar135 = ray->tfar;
  auVar140._4_4_ = fVar135;
  auVar140._0_4_ = fVar135;
  auVar140._8_4_ = fVar135;
  auVar140._12_4_ = fVar135;
  auVar140._16_4_ = fVar135;
  auVar140._20_4_ = fVar135;
  auVar140._24_4_ = fVar135;
  auVar140._28_4_ = fVar135;
  auVar115 = vminps_avx(auVar115,auVar140);
  auVar153 = vminps_avx(auVar153,auVar115);
  auVar148._4_4_ = auVar153._4_4_ * 1.0000004;
  auVar148._0_4_ = auVar153._0_4_ * 1.0000004;
  auVar148._8_4_ = auVar153._8_4_ * 1.0000004;
  auVar148._12_4_ = auVar153._12_4_ * 1.0000004;
  auVar148._16_4_ = auVar153._16_4_ * 1.0000004;
  auVar148._20_4_ = auVar153._20_4_ * 1.0000004;
  auVar148._24_4_ = auVar153._24_4_ * 1.0000004;
  auVar148._28_4_ = auVar153._28_4_;
  auVar109[4] = PVar18;
  auVar109._5_3_ = 0;
  auVar109[8] = PVar18;
  auVar109._9_3_ = 0;
  auVar109[0xc] = PVar18;
  auVar109._13_3_ = 0;
  auVar109[0x10] = PVar18;
  auVar109._17_3_ = 0;
  auVar109[0x14] = PVar18;
  auVar109._21_3_ = 0;
  auVar109[0x18] = PVar18;
  auVar109._25_3_ = 0;
  auVar109[0x1c] = PVar18;
  auVar109._29_3_ = 0;
  auVar115 = vpcmpgtd_avx2(auVar109,_DAT_01fe9900);
  auVar153 = vcmpps_avx(local_80,auVar148,2);
  auVar153 = vandps_avx(auVar153,auVar115);
  uVar98 = vmovmskps_avx(auVar153);
  if (uVar98 == 0) {
    bVar103 = false;
  }
  else {
    uVar98 = uVar98 & 0xff;
    local_480 = mm_lookupmask_ps._16_8_;
    uStack_478 = mm_lookupmask_ps._24_8_;
    uStack_470 = mm_lookupmask_ps._16_8_;
    uStack_468 = mm_lookupmask_ps._24_8_;
    local_290 = 0x7fffffff;
    uStack_28c = 0x7fffffff;
    uStack_288 = 0x7fffffff;
    uStack_284 = 0x7fffffff;
    local_7a8 = prim;
    do {
      local_700 = auVar190._0_32_;
      auVar153 = auVar187._0_32_;
      auVar115 = auVar196._0_32_;
      lVar22 = 0;
      uVar104 = (ulong)uVar98;
      for (uVar99 = uVar104; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      local_690 = (ulong)*(uint *)(local_7a8 + 2);
      pGVar100 = (context->scene->geometries).items[*(uint *)(local_7a8 + 2)].ptr;
      local_508 = (ulong)*(uint *)(local_7a8 + lVar22 * 4 + 6);
      uVar99 = (ulong)*(uint *)(*(long *)&pGVar100->field_0x58 +
                               pGVar100[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(local_7a8 + lVar22 * 4 + 6));
      p_Var20 = pGVar100[1].intersectionFilterN;
      lVar22 = *(long *)&pGVar100[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar22 + (long)p_Var20 * uVar99);
      local_5e0 = *(undefined8 *)*pauVar1;
      uStack_5d8 = *(undefined8 *)(*pauVar1 + 8);
      pauVar2 = (undefined1 (*) [16])(lVar22 + (uVar99 + 1) * (long)p_Var20);
      local_5f0 = *(undefined8 *)*pauVar2;
      uStack_5e8 = *(undefined8 *)(*pauVar2 + 8);
      pauVar3 = (undefined1 (*) [16])(lVar22 + (uVar99 + 2) * (long)p_Var20);
      local_600 = *(undefined8 *)*pauVar3;
      uStack_5f8 = *(undefined8 *)(*pauVar3 + 8);
      uVar104 = uVar104 - 1 & uVar104;
      pauVar4 = (undefined1 (*) [12])(lVar22 + (uVar99 + 3) * (long)p_Var20);
      local_490 = (float)*(undefined8 *)*pauVar4;
      fStack_48c = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
      fStack_488 = (float)*(undefined8 *)(*pauVar4 + 8);
      fStack_484 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
      if (uVar104 != 0) {
        uVar102 = uVar104 - 1 & uVar104;
        for (uVar99 = uVar104; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
        }
        if (uVar102 != 0) {
          for (; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar19 = (int)pGVar100[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar7 = (ray->org).field_0;
      auVar10 = vsubps_avx(*pauVar1,(undefined1  [16])aVar7);
      uVar105 = auVar10._0_4_;
      auVar145._4_4_ = uVar105;
      auVar145._0_4_ = uVar105;
      auVar145._8_4_ = uVar105;
      auVar145._12_4_ = uVar105;
      auVar21 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      aVar8 = (local_688->ray_space).vx.field_0;
      aVar9 = (local_688->ray_space).vy.field_0;
      fVar135 = (local_688->ray_space).vz.field_0.m128[0];
      fVar118 = (local_688->ray_space).vz.field_0.m128[1];
      fVar119 = (local_688->ray_space).vz.field_0.m128[2];
      fVar120 = (local_688->ray_space).vz.field_0.m128[3];
      auVar155._0_4_ = auVar10._0_4_ * fVar135;
      auVar155._4_4_ = auVar10._4_4_ * fVar118;
      auVar155._8_4_ = auVar10._8_4_ * fVar119;
      auVar155._12_4_ = auVar10._12_4_ * fVar120;
      auVar21 = vfmadd231ps_fma(auVar155,(undefined1  [16])aVar9,auVar21);
      auVar14 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar8,auVar145);
      auVar21 = vblendps_avx(auVar14,*pauVar1,8);
      auVar11 = vsubps_avx(*pauVar2,(undefined1  [16])aVar7);
      uVar105 = auVar11._0_4_;
      auVar156._4_4_ = uVar105;
      auVar156._0_4_ = uVar105;
      auVar156._8_4_ = uVar105;
      auVar156._12_4_ = uVar105;
      auVar10 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar182._0_4_ = auVar11._0_4_ * fVar135;
      auVar182._4_4_ = auVar11._4_4_ * fVar118;
      auVar182._8_4_ = auVar11._8_4_ * fVar119;
      auVar182._12_4_ = auVar11._12_4_ * fVar120;
      auVar10 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar9,auVar10);
      auVar15 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar8,auVar156);
      auVar10 = vblendps_avx(auVar15,*pauVar2,8);
      auVar12 = vsubps_avx(*pauVar3,(undefined1  [16])aVar7);
      uVar105 = auVar12._0_4_;
      auVar165._4_4_ = uVar105;
      auVar165._0_4_ = uVar105;
      auVar165._8_4_ = uVar105;
      auVar165._12_4_ = uVar105;
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar194._0_4_ = auVar12._0_4_ * fVar135;
      auVar194._4_4_ = auVar12._4_4_ * fVar118;
      auVar194._8_4_ = auVar12._8_4_ * fVar119;
      auVar194._12_4_ = auVar12._12_4_ * fVar120;
      auVar11 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar9,auVar11);
      auVar16 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar8,auVar165);
      auVar11 = vblendps_avx(auVar16,*pauVar3,8);
      auVar24._12_4_ = fStack_484;
      auVar24._0_12_ = *pauVar4;
      local_5a0._0_16_ = (undefined1  [16])aVar7;
      auVar13 = vsubps_avx(auVar24,(undefined1  [16])aVar7);
      uVar105 = auVar13._0_4_;
      auVar170._4_4_ = uVar105;
      auVar170._0_4_ = uVar105;
      auVar170._8_4_ = uVar105;
      auVar170._12_4_ = uVar105;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar197._0_4_ = auVar13._0_4_ * fVar135;
      auVar197._4_4_ = auVar13._4_4_ * fVar118;
      auVar197._8_4_ = auVar13._8_4_ * fVar119;
      auVar197._12_4_ = auVar13._12_4_ * fVar120;
      auVar12 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar9,auVar12);
      auVar17 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar8,auVar170);
      auVar12 = vblendps_avx(auVar17,auVar24,8);
      auVar26._4_4_ = uStack_28c;
      auVar26._0_4_ = local_290;
      auVar26._8_4_ = uStack_288;
      auVar26._12_4_ = uStack_284;
      auVar21 = vandps_avx(auVar21,auVar26);
      auVar10 = vandps_avx(auVar10,auVar26);
      auVar13 = vmaxps_avx(auVar21,auVar10);
      auVar21 = vandps_avx(auVar11,auVar26);
      auVar10 = vandps_avx(auVar12,auVar26);
      auVar21 = vmaxps_avx(auVar21,auVar10);
      auVar21 = vmaxps_avx(auVar13,auVar21);
      auVar10 = vmovshdup_avx(auVar21);
      auVar10 = vmaxss_avx(auVar10,auVar21);
      auVar21 = vshufpd_avx(auVar21,auVar21,1);
      auVar21 = vmaxss_avx(auVar21,auVar10);
      lVar22 = (long)iVar19 * 0x44;
      auVar10 = vmovshdup_avx(auVar14);
      uVar106 = auVar10._0_8_;
      local_420._8_8_ = uVar106;
      local_420._0_8_ = uVar106;
      local_420._16_8_ = uVar106;
      local_420._24_8_ = uVar106;
      auVar10 = vmovshdup_avx(auVar15);
      uVar106 = auVar10._0_8_;
      local_6c0._8_8_ = uVar106;
      local_6c0._0_8_ = uVar106;
      local_6c0._16_8_ = uVar106;
      local_6c0._24_8_ = uVar106;
      auVar173 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x908);
      uVar193 = auVar16._0_4_;
      local_6e0._4_4_ = uVar193;
      local_6e0._0_4_ = uVar193;
      local_6e0._8_4_ = uVar193;
      local_6e0._12_4_ = uVar193;
      local_6e0._16_4_ = uVar193;
      local_6e0._20_4_ = uVar193;
      local_6e0._24_4_ = uVar193;
      local_6e0._28_4_ = uVar193;
      auVar10 = vmovshdup_avx(auVar16);
      uVar106 = auVar10._0_8_;
      local_620._8_8_ = uVar106;
      local_620._0_8_ = uVar106;
      local_620._16_8_ = uVar106;
      local_620._24_8_ = uVar106;
      local_300 = *(float *)(bezier_basis0 + lVar22 + 0xd8c);
      fStack_2fc = *(float *)(bezier_basis0 + lVar22 + 0xd90);
      fStack_2f8 = *(float *)(bezier_basis0 + lVar22 + 0xd94);
      fStack_2f4 = *(float *)(bezier_basis0 + lVar22 + 0xd98);
      fStack_2f0 = *(float *)(bezier_basis0 + lVar22 + 0xd9c);
      fStack_2ec = *(float *)(bezier_basis0 + lVar22 + 0xda0);
      fStack_2e8 = *(float *)(bezier_basis0 + lVar22 + 0xda4);
      local_640 = auVar17._0_4_;
      auVar10 = vmovshdup_avx(auVar17);
      local_560 = auVar10._0_8_;
      auVar201._0_4_ = local_300 * local_640;
      auVar201._4_4_ = fStack_2fc * local_640;
      auVar201._8_4_ = fStack_2f8 * local_640;
      auVar201._12_4_ = fStack_2f4 * local_640;
      auVar201._16_4_ = fStack_2f0 * local_640;
      auVar201._20_4_ = fStack_2ec * local_640;
      auVar201._24_4_ = fStack_2e8 * local_640;
      auVar201._28_4_ = 0;
      fVar203 = auVar10._0_4_;
      auVar108._0_4_ = fVar203 * local_300;
      fVar207 = auVar10._4_4_;
      auVar108._4_4_ = fVar207 * fStack_2fc;
      auVar108._8_4_ = fVar203 * fStack_2f8;
      auVar108._12_4_ = fVar207 * fStack_2f4;
      auVar108._16_4_ = fVar203 * fStack_2f0;
      auVar108._20_4_ = fVar207 * fStack_2ec;
      auVar108._24_4_ = fVar203 * fStack_2e8;
      auVar108._28_4_ = 0;
      auVar10 = vfmadd231ps_fma(auVar201,auVar173,local_6e0);
      auVar11 = vfmadd231ps_fma(auVar108,auVar173,local_620);
      auVar163 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x484);
      uVar105 = auVar15._0_4_;
      local_660._4_4_ = uVar105;
      local_660._0_4_ = uVar105;
      local_660._8_4_ = uVar105;
      local_660._12_4_ = uVar105;
      local_660._16_4_ = uVar105;
      local_660._20_4_ = uVar105;
      local_660._24_4_ = uVar105;
      local_660._28_4_ = uVar105;
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar163,local_660);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar163,local_6c0);
      auVar129 = *(undefined1 (*) [32])(bezier_basis0 + lVar22);
      uVar105 = auVar14._0_4_;
      local_4e0._4_4_ = uVar105;
      local_4e0._0_4_ = uVar105;
      local_4e0._8_4_ = uVar105;
      local_4e0._12_4_ = uVar105;
      local_4e0._16_4_ = uVar105;
      local_4e0._20_4_ = uVar105;
      local_4e0._24_4_ = uVar105;
      local_4e0._28_4_ = uVar105;
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar129,local_4e0);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar129,local_420);
      auVar186 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x908);
      fVar179 = *(float *)(bezier_basis1 + lVar22 + 0xd8c);
      fVar180 = *(float *)(bezier_basis1 + lVar22 + 0xd90);
      fVar181 = *(float *)(bezier_basis1 + lVar22 + 0xd94);
      fVar191 = *(float *)(bezier_basis1 + lVar22 + 0xd98);
      fVar192 = *(float *)(bezier_basis1 + lVar22 + 0xd9c);
      fVar88 = *(float *)(bezier_basis1 + lVar22 + 0xda0);
      fVar89 = *(float *)(bezier_basis1 + lVar22 + 0xda4);
      fStack_63c = local_640;
      fStack_638 = local_640;
      fStack_634 = local_640;
      fStack_630 = local_640;
      fStack_62c = local_640;
      fStack_628 = local_640;
      fStack_624 = local_640;
      auVar27._4_4_ = local_640 * fVar180;
      auVar27._0_4_ = local_640 * fVar179;
      auVar27._8_4_ = local_640 * fVar181;
      auVar27._12_4_ = local_640 * fVar191;
      auVar27._16_4_ = local_640 * fVar192;
      auVar27._20_4_ = local_640 * fVar88;
      auVar27._24_4_ = local_640 * fVar89;
      auVar27._28_4_ = local_640;
      auVar12 = vfmadd231ps_fma(auVar27,auVar186,local_6e0);
      uStack_558 = local_560;
      uStack_550 = local_560;
      uStack_548 = local_560;
      auVar28._4_4_ = fVar207 * fVar180;
      auVar28._0_4_ = fVar203 * fVar179;
      auVar28._8_4_ = fVar203 * fVar181;
      auVar28._12_4_ = fVar207 * fVar191;
      auVar28._16_4_ = fVar203 * fVar192;
      auVar28._20_4_ = fVar207 * fVar88;
      auVar28._24_4_ = fVar203 * fVar89;
      auVar28._28_4_ = uVar193;
      auVar13 = vfmadd231ps_fma(auVar28,auVar186,local_620);
      auVar141 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x484);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar141,local_660);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar141,local_6c0);
      auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar22);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar117,local_4e0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar117,local_420);
      auVar124 = ZEXT1632(auVar12);
      local_2e0 = ZEXT1632(auVar10);
      local_340 = vsubps_avx(auVar124,local_2e0);
      auVar164 = ZEXT3264(local_340);
      local_2c0 = ZEXT1632(auVar13);
      auVar109 = ZEXT1632(auVar11);
      local_320 = vsubps_avx(local_2c0,auVar109);
      auVar110._0_4_ = auVar11._0_4_ * local_340._0_4_;
      auVar110._4_4_ = auVar11._4_4_ * local_340._4_4_;
      auVar110._8_4_ = auVar11._8_4_ * local_340._8_4_;
      auVar110._12_4_ = auVar11._12_4_ * local_340._12_4_;
      auVar110._16_4_ = local_340._16_4_ * 0.0;
      auVar110._20_4_ = local_340._20_4_ * 0.0;
      auVar110._24_4_ = local_340._24_4_ * 0.0;
      auVar110._28_4_ = 0;
      fVar135 = local_320._0_4_;
      auVar125._0_4_ = auVar10._0_4_ * fVar135;
      fVar119 = local_320._4_4_;
      auVar125._4_4_ = auVar10._4_4_ * fVar119;
      fVar121 = local_320._8_4_;
      auVar125._8_4_ = auVar10._8_4_ * fVar121;
      fVar122 = local_320._12_4_;
      auVar125._12_4_ = auVar10._12_4_ * fVar122;
      fVar123 = local_320._16_4_;
      auVar125._16_4_ = fVar123 * 0.0;
      fVar188 = local_320._20_4_;
      auVar125._20_4_ = fVar188 * 0.0;
      fVar175 = local_320._24_4_;
      auVar125._24_4_ = fVar175 * 0.0;
      auVar125._28_4_ = 0;
      auVar131 = vsubps_avx(auVar110,auVar125);
      auVar10 = vpermilps_avx(*pauVar1,0xff);
      uVar106 = auVar10._0_8_;
      local_a0._8_8_ = uVar106;
      local_a0._0_8_ = uVar106;
      local_a0._16_8_ = uVar106;
      local_a0._24_8_ = uVar106;
      auVar11 = vpermilps_avx(*pauVar2,0xff);
      uVar106 = auVar11._0_8_;
      local_c0._8_8_ = uVar106;
      local_c0._0_8_ = uVar106;
      local_c0._16_8_ = uVar106;
      local_c0._24_8_ = uVar106;
      auVar11 = vpermilps_avx(*pauVar3,0xff);
      uVar106 = auVar11._0_8_;
      local_e0._8_8_ = uVar106;
      local_e0._0_8_ = uVar106;
      local_e0._16_8_ = uVar106;
      local_e0._24_8_ = uVar106;
      auVar25._12_4_ = fStack_484;
      auVar25._0_12_ = *pauVar4;
      auVar11 = vpermilps_avx(auVar25,0xff);
      local_100 = auVar11._0_8_;
      fStack_2e4 = (float)*(undefined4 *)(bezier_basis0 + lVar22 + 0xda8);
      fVar118 = auVar11._0_4_;
      fVar120 = auVar11._4_4_;
      auVar29._4_4_ = fStack_2fc * fVar120;
      auVar29._0_4_ = local_300 * fVar118;
      auVar29._8_4_ = fStack_2f8 * fVar118;
      auVar29._12_4_ = fStack_2f4 * fVar120;
      auVar29._16_4_ = fStack_2f0 * fVar118;
      auVar29._20_4_ = fStack_2ec * fVar120;
      auVar29._24_4_ = fStack_2e8 * fVar118;
      auVar29._28_4_ = fVar207;
      auVar11 = vfmadd231ps_fma(auVar29,local_e0,auVar173);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar163,local_c0);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar129,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar30._4_4_ = fVar120 * fVar180;
      auVar30._0_4_ = fVar118 * fVar179;
      auVar30._8_4_ = fVar118 * fVar181;
      auVar30._12_4_ = fVar120 * fVar191;
      auVar30._16_4_ = fVar118 * fVar192;
      auVar30._20_4_ = fVar120 * fVar88;
      auVar30._24_4_ = fVar118 * fVar89;
      auVar30._28_4_ = auVar129._28_4_;
      auVar12 = vfmadd231ps_fma(auVar30,auVar186,local_e0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar141,local_c0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar117,local_a0);
      auVar31._4_4_ = fVar119 * fVar119;
      auVar31._0_4_ = fVar135 * fVar135;
      auVar31._8_4_ = fVar121 * fVar121;
      auVar31._12_4_ = fVar122 * fVar122;
      auVar31._16_4_ = fVar123 * fVar123;
      auVar31._20_4_ = fVar188 * fVar188;
      auVar31._24_4_ = fVar175 * fVar175;
      auVar31._28_4_ = auVar10._4_4_;
      auVar10 = vfmadd231ps_fma(auVar31,local_340,local_340);
      auVar176 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
      auVar32._4_4_ = auVar176._4_4_ * auVar176._4_4_ * auVar10._4_4_;
      auVar32._0_4_ = auVar176._0_4_ * auVar176._0_4_ * auVar10._0_4_;
      auVar32._8_4_ = auVar176._8_4_ * auVar176._8_4_ * auVar10._8_4_;
      auVar32._12_4_ = auVar176._12_4_ * auVar176._12_4_ * auVar10._12_4_;
      auVar32._16_4_ = auVar176._16_4_ * auVar176._16_4_ * 0.0;
      auVar32._20_4_ = auVar176._20_4_ * auVar176._20_4_ * 0.0;
      auVar32._24_4_ = auVar176._24_4_ * auVar176._24_4_ * 0.0;
      auVar32._28_4_ = auVar176._28_4_;
      auVar33._4_4_ = auVar131._4_4_ * auVar131._4_4_;
      auVar33._0_4_ = auVar131._0_4_ * auVar131._0_4_;
      auVar33._8_4_ = auVar131._8_4_ * auVar131._8_4_;
      auVar33._12_4_ = auVar131._12_4_ * auVar131._12_4_;
      auVar33._16_4_ = auVar131._16_4_ * auVar131._16_4_;
      auVar33._20_4_ = auVar131._20_4_ * auVar131._20_4_;
      auVar33._24_4_ = auVar131._24_4_ * auVar131._24_4_;
      auVar33._28_4_ = auVar131._28_4_;
      auVar176 = vcmpps_avx(auVar33,auVar32,2);
      local_400._0_4_ = (undefined4)iVar19;
      register0x00001204 = auVar17._4_12_;
      fVar135 = auVar21._0_4_ * 4.7683716e-07;
      auVar111._4_4_ = local_400._0_4_;
      auVar111._0_4_ = local_400._0_4_;
      auVar111._8_4_ = local_400._0_4_;
      auVar111._12_4_ = local_400._0_4_;
      auVar111._16_4_ = local_400._0_4_;
      auVar111._20_4_ = local_400._0_4_;
      auVar111._24_4_ = local_400._0_4_;
      auVar111._28_4_ = local_400._0_4_;
      auVar131 = vcmpps_avx(_DAT_01faff40,auVar111,1);
      auVar21 = vpermilps_avx(auVar14,0xaa);
      uVar106 = auVar21._0_8_;
      local_360._8_8_ = uVar106;
      local_360._0_8_ = uVar106;
      local_360._16_8_ = uVar106;
      local_360._24_8_ = uVar106;
      auVar21 = vpermilps_avx(auVar15,0xaa);
      uVar106 = auVar21._0_8_;
      local_580._8_8_ = uVar106;
      local_580._0_8_ = uVar106;
      local_580._16_8_ = uVar106;
      local_580._24_8_ = uVar106;
      auVar21 = vpermilps_avx(auVar16,0xaa);
      uVar106 = auVar21._0_8_;
      local_3e0._8_8_ = uVar106;
      local_3e0._0_8_ = uVar106;
      local_3e0._16_8_ = uVar106;
      local_3e0._24_8_ = uVar106;
      auVar21 = vshufps_avx(auVar17,auVar17,0xaa);
      uVar106 = auVar21._0_8_;
      register0x00001508 = uVar106;
      local_500 = uVar106;
      register0x00001510 = uVar106;
      register0x00001518 = uVar106;
      auVar148 = auVar131 & auVar176;
      local_780._0_16_ = ZEXT416((uint)fVar135);
      if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar148 >> 0x7f,0) == '\0') &&
            (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar148 >> 0xbf,0) == '\0') &&
          (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar148[0x1f]) {
        auVar196 = ZEXT3264(auVar115);
        auVar187 = ZEXT3264(auVar153);
LAB_01817b02:
        auVar174 = ZEXT3264(CONCAT428(local_640,
                                      CONCAT424(local_640,
                                                CONCAT420(local_640,
                                                          CONCAT416(local_640,
                                                                    CONCAT412(local_640,
                                                                              CONCAT48(local_640,
                                                                                       CONCAT44(
                                                  local_640,local_640))))))));
LAB_01817b1d:
        auVar210 = ZEXT3264(local_6e0);
        auVar206 = ZEXT3264(local_6c0);
        auVar199 = ZEXT3264(_local_500);
        auVar190 = ZEXT3264(local_700);
        auVar178 = ZEXT3264(local_660);
        auVar168 = ZEXT3264(local_620);
        bVar103 = false;
        auVar134 = ZEXT3264(local_740);
        auVar151 = ZEXT3264(local_4e0);
      }
      else {
        local_760 = vandps_avx(auVar176,auVar131);
        fVar175 = auVar21._0_4_;
        fVar200 = auVar21._4_4_;
        auVar34._4_4_ = fVar200 * fVar180;
        auVar34._0_4_ = fVar175 * fVar179;
        auVar34._8_4_ = fVar175 * fVar181;
        auVar34._12_4_ = fVar200 * fVar191;
        auVar34._16_4_ = fVar175 * fVar192;
        auVar34._20_4_ = fVar200 * fVar88;
        auVar34._24_4_ = fVar175 * fVar89;
        auVar34._28_4_ = local_760._28_4_;
        auVar21 = vfmadd213ps_fma(auVar186,local_3e0,auVar34);
        auVar21 = vfmadd213ps_fma(auVar141,local_580,ZEXT1632(auVar21));
        auVar21 = vfmadd213ps_fma(auVar117,local_360,ZEXT1632(auVar21));
        local_380 = ZEXT1632(auVar21);
        auVar35._4_4_ = fVar200 * fStack_2fc;
        auVar35._0_4_ = fVar175 * local_300;
        auVar35._8_4_ = fVar175 * fStack_2f8;
        auVar35._12_4_ = fVar200 * fStack_2f4;
        auVar35._16_4_ = fVar175 * fStack_2f0;
        auVar35._20_4_ = fVar200 * fStack_2ec;
        auVar35._24_4_ = fVar175 * fStack_2e8;
        auVar35._28_4_ = local_760._28_4_;
        auVar21 = vfmadd213ps_fma(auVar173,local_3e0,auVar35);
        auVar21 = vfmadd213ps_fma(auVar163,local_580,ZEXT1632(auVar21));
        auVar173 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1210);
        auVar163 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1694);
        auVar186 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1b18);
        fVar118 = *(float *)(bezier_basis0 + lVar22 + 0x1f9c);
        fVar119 = *(float *)(bezier_basis0 + lVar22 + 0x1fa0);
        fVar120 = *(float *)(bezier_basis0 + lVar22 + 0x1fa4);
        fVar121 = *(float *)(bezier_basis0 + lVar22 + 0x1fa8);
        fVar122 = *(float *)(bezier_basis0 + lVar22 + 0x1fac);
        fVar123 = *(float *)(bezier_basis0 + lVar22 + 0x1fb0);
        fVar188 = *(float *)(bezier_basis0 + lVar22 + 0x1fb4);
        auVar36._4_4_ = local_640 * fVar119;
        auVar36._0_4_ = local_640 * fVar118;
        auVar36._8_4_ = local_640 * fVar120;
        auVar36._12_4_ = local_640 * fVar121;
        auVar36._16_4_ = local_640 * fVar122;
        auVar36._20_4_ = local_640 * fVar123;
        auVar36._24_4_ = local_640 * fVar188;
        auVar36._28_4_ = local_340._28_4_;
        auVar37._4_4_ = fVar207 * fVar119;
        auVar37._0_4_ = fVar203 * fVar118;
        auVar37._8_4_ = fVar203 * fVar120;
        auVar37._12_4_ = fVar207 * fVar121;
        auVar37._16_4_ = fVar203 * fVar122;
        auVar37._20_4_ = fVar207 * fVar123;
        auVar37._24_4_ = fVar203 * fVar188;
        auVar37._28_4_ = *(undefined4 *)(bezier_basis1 + lVar22 + 0xda8);
        auVar189._0_4_ = fVar175 * fVar118;
        auVar189._4_4_ = fVar200 * fVar119;
        auVar189._8_4_ = fVar175 * fVar120;
        auVar189._12_4_ = fVar200 * fVar121;
        auVar189._16_4_ = fVar175 * fVar122;
        auVar189._20_4_ = fVar200 * fVar123;
        auVar189._24_4_ = fVar175 * fVar188;
        auVar189._28_4_ = 0;
        auVar10 = vfmadd231ps_fma(auVar36,auVar186,local_6e0);
        auVar13 = vfmadd231ps_fma(auVar37,auVar186,local_620);
        auVar14 = vfmadd231ps_fma(auVar189,local_3e0,auVar186);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar163,local_660);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar163,local_6c0);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_580,auVar163);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar173,local_4e0);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar173,local_420);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_360,auVar173);
        fVar118 = *(float *)(bezier_basis1 + lVar22 + 0x1f9c);
        fVar119 = *(float *)(bezier_basis1 + lVar22 + 0x1fa0);
        fVar120 = *(float *)(bezier_basis1 + lVar22 + 0x1fa4);
        fVar121 = *(float *)(bezier_basis1 + lVar22 + 0x1fa8);
        fVar122 = *(float *)(bezier_basis1 + lVar22 + 0x1fac);
        fVar123 = *(float *)(bezier_basis1 + lVar22 + 0x1fb0);
        fVar188 = *(float *)(bezier_basis1 + lVar22 + 0x1fb4);
        auVar38._4_4_ = local_640 * fVar119;
        auVar38._0_4_ = local_640 * fVar118;
        auVar38._8_4_ = local_640 * fVar120;
        auVar38._12_4_ = local_640 * fVar121;
        auVar38._16_4_ = local_640 * fVar122;
        auVar38._20_4_ = local_640 * fVar123;
        auVar38._24_4_ = local_640 * fVar188;
        auVar38._28_4_ = local_640;
        auVar39._4_4_ = fVar207 * fVar119;
        auVar39._0_4_ = fVar203 * fVar118;
        auVar39._8_4_ = fVar203 * fVar120;
        auVar39._12_4_ = fVar207 * fVar121;
        auVar39._16_4_ = fVar203 * fVar122;
        auVar39._20_4_ = fVar207 * fVar123;
        auVar39._24_4_ = fVar203 * fVar188;
        auVar39._28_4_ = fVar207;
        auVar40._4_4_ = fVar200 * fVar119;
        auVar40._0_4_ = fVar175 * fVar118;
        auVar40._8_4_ = fVar175 * fVar120;
        auVar40._12_4_ = fVar200 * fVar121;
        auVar40._16_4_ = fVar175 * fVar122;
        auVar40._20_4_ = fVar200 * fVar123;
        auVar40._24_4_ = fVar175 * fVar188;
        auVar40._28_4_ = fVar200;
        auVar173 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1b18);
        auVar15 = vfmadd231ps_fma(auVar38,auVar173,local_6e0);
        auVar16 = vfmadd231ps_fma(auVar39,auVar173,local_620);
        auVar17 = vfmadd231ps_fma(auVar40,auVar173,local_3e0);
        auVar173 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1694);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar173,local_660);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar173,local_6c0);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar173,local_580);
        auVar173 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1210);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar173,local_4e0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar173,local_420);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_360,auVar173);
        auVar173 = vandps_avx(local_280,ZEXT1632(auVar10));
        auVar163 = vandps_avx(ZEXT1632(auVar13),local_280);
        auVar163 = vmaxps_avx(auVar173,auVar163);
        auVar173 = vandps_avx(ZEXT1632(auVar14),local_280);
        auVar173 = vmaxps_avx(auVar163,auVar173);
        auVar126._4_4_ = fVar135;
        auVar126._0_4_ = fVar135;
        auVar126._8_4_ = fVar135;
        auVar126._12_4_ = fVar135;
        auVar126._16_4_ = fVar135;
        auVar126._20_4_ = fVar135;
        auVar126._24_4_ = fVar135;
        auVar126._28_4_ = fVar135;
        auVar173 = vcmpps_avx(auVar173,auVar126,1);
        auVar186 = vblendvps_avx(ZEXT1632(auVar10),local_340,auVar173);
        auVar141 = vblendvps_avx(ZEXT1632(auVar13),local_320,auVar173);
        auVar173 = vandps_avx(ZEXT1632(auVar15),local_280);
        auVar163 = vandps_avx(ZEXT1632(auVar16),local_280);
        auVar163 = vmaxps_avx(auVar173,auVar163);
        auVar173 = vandps_avx(ZEXT1632(auVar17),local_280);
        auVar173 = vmaxps_avx(auVar163,auVar173);
        auVar163 = vcmpps_avx(auVar173,auVar126,1);
        auVar173 = vblendvps_avx(ZEXT1632(auVar15),local_340,auVar163);
        auVar163 = vblendvps_avx(ZEXT1632(auVar16),local_320,auVar163);
        auVar21 = vfmadd213ps_fma(auVar129,local_360,ZEXT1632(auVar21));
        auVar10 = vfmadd213ps_fma(auVar186,auVar186,ZEXT832(0) << 0x20);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar141,auVar141);
        auVar117 = vrsqrtps_avx(ZEXT1632(auVar10));
        fVar135 = auVar117._0_4_;
        fVar118 = auVar117._4_4_;
        fVar119 = auVar117._8_4_;
        fVar120 = auVar117._12_4_;
        fVar121 = auVar117._16_4_;
        fVar122 = auVar117._20_4_;
        fVar123 = auVar117._24_4_;
        auVar41._4_4_ = fVar118 * fVar118 * fVar118 * auVar10._4_4_ * -0.5;
        auVar41._0_4_ = fVar135 * fVar135 * fVar135 * auVar10._0_4_ * -0.5;
        auVar41._8_4_ = fVar119 * fVar119 * fVar119 * auVar10._8_4_ * -0.5;
        auVar41._12_4_ = fVar120 * fVar120 * fVar120 * auVar10._12_4_ * -0.5;
        auVar41._16_4_ = fVar121 * fVar121 * fVar121 * -0.0;
        auVar41._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar41._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar41._28_4_ = 0;
        auVar202._8_4_ = 0x3fc00000;
        auVar202._0_8_ = 0x3fc000003fc00000;
        auVar202._12_4_ = 0x3fc00000;
        auVar202._16_4_ = 0x3fc00000;
        auVar202._20_4_ = 0x3fc00000;
        auVar202._24_4_ = 0x3fc00000;
        auVar202._28_4_ = 0x3fc00000;
        auVar10 = vfmadd231ps_fma(auVar41,auVar202,auVar117);
        fVar135 = auVar10._0_4_;
        fVar118 = auVar10._4_4_;
        auVar42._4_4_ = auVar141._4_4_ * fVar118;
        auVar42._0_4_ = auVar141._0_4_ * fVar135;
        fVar119 = auVar10._8_4_;
        auVar42._8_4_ = auVar141._8_4_ * fVar119;
        fVar120 = auVar10._12_4_;
        auVar42._12_4_ = auVar141._12_4_ * fVar120;
        auVar42._16_4_ = auVar141._16_4_ * 0.0;
        auVar42._20_4_ = auVar141._20_4_ * 0.0;
        auVar42._24_4_ = auVar141._24_4_ * 0.0;
        auVar42._28_4_ = auVar117._28_4_;
        auVar43._4_4_ = -auVar186._4_4_ * fVar118;
        auVar43._0_4_ = -auVar186._0_4_ * fVar135;
        auVar43._8_4_ = -auVar186._8_4_ * fVar119;
        auVar43._12_4_ = -auVar186._12_4_ * fVar120;
        auVar43._16_4_ = -auVar186._16_4_ * 0.0;
        auVar43._20_4_ = -auVar186._20_4_ * 0.0;
        auVar43._24_4_ = -auVar186._24_4_ * 0.0;
        auVar43._28_4_ = 0;
        auVar10 = vfmadd213ps_fma(auVar173,auVar173,ZEXT832(0) << 0x20);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar163,auVar163);
        auVar186 = vrsqrtps_avx(ZEXT1632(auVar10));
        auVar141 = ZEXT1632(CONCAT412(fVar120 * 0.0,
                                      CONCAT48(fVar119 * 0.0,CONCAT44(fVar118 * 0.0,fVar135 * 0.0)))
                           );
        fVar135 = auVar186._0_4_;
        fVar118 = auVar186._4_4_;
        fVar119 = auVar186._8_4_;
        fVar120 = auVar186._12_4_;
        fVar121 = auVar186._16_4_;
        fVar122 = auVar186._20_4_;
        fVar123 = auVar186._24_4_;
        auVar44._4_4_ = fVar118 * fVar118 * fVar118 * auVar10._4_4_ * -0.5;
        auVar44._0_4_ = fVar135 * fVar135 * fVar135 * auVar10._0_4_ * -0.5;
        auVar44._8_4_ = fVar119 * fVar119 * fVar119 * auVar10._8_4_ * -0.5;
        auVar44._12_4_ = fVar120 * fVar120 * fVar120 * auVar10._12_4_ * -0.5;
        auVar44._16_4_ = fVar121 * fVar121 * fVar121 * -0.0;
        auVar44._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar44._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar44._28_4_ = 0xbf000000;
        auVar10 = vfmadd231ps_fma(auVar44,auVar202,auVar186);
        fVar135 = auVar10._0_4_;
        fVar118 = auVar10._4_4_;
        auVar45._4_4_ = fVar118 * auVar163._4_4_;
        auVar45._0_4_ = fVar135 * auVar163._0_4_;
        fVar119 = auVar10._8_4_;
        auVar45._8_4_ = fVar119 * auVar163._8_4_;
        fVar120 = auVar10._12_4_;
        auVar45._12_4_ = fVar120 * auVar163._12_4_;
        auVar45._16_4_ = auVar163._16_4_ * 0.0;
        auVar45._20_4_ = auVar163._20_4_ * 0.0;
        auVar45._24_4_ = auVar163._24_4_ * 0.0;
        auVar45._28_4_ = 0;
        auVar46._4_4_ = fVar118 * -auVar173._4_4_;
        auVar46._0_4_ = fVar135 * -auVar173._0_4_;
        auVar46._8_4_ = fVar119 * -auVar173._8_4_;
        auVar46._12_4_ = fVar120 * -auVar173._12_4_;
        auVar46._16_4_ = -auVar173._16_4_ * 0.0;
        auVar46._20_4_ = -auVar173._20_4_ * 0.0;
        auVar46._24_4_ = -auVar173._24_4_ * 0.0;
        auVar46._28_4_ = 0x3fc00000;
        auVar47._28_4_ = auVar186._28_4_;
        auVar47._0_28_ =
             ZEXT1628(CONCAT412(fVar120 * 0.0,
                                CONCAT48(fVar119 * 0.0,CONCAT44(fVar118 * 0.0,fVar135 * 0.0))));
        auVar10 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar11),local_2e0);
        auVar173 = ZEXT1632(auVar11);
        auVar13 = vfmadd213ps_fma(auVar43,auVar173,auVar109);
        auVar14 = vfmadd213ps_fma(auVar141,auVar173,ZEXT1632(auVar21));
        auVar17 = vfnmadd213ps_fma(auVar42,auVar173,local_2e0);
        auVar15 = vfmadd213ps_fma(auVar45,ZEXT1632(auVar12),auVar124);
        auVar107 = vfnmadd213ps_fma(auVar43,auVar173,auVar109);
        auVar173 = ZEXT1632(auVar12);
        auVar16 = vfmadd213ps_fma(auVar46,auVar173,local_2c0);
        local_440 = ZEXT1632(auVar11);
        auVar25 = vfnmadd231ps_fma(ZEXT1632(auVar21),local_440,auVar141);
        auVar11 = vfmadd213ps_fma(auVar47,auVar173,local_380);
        auVar169 = vfnmadd213ps_fma(auVar45,auVar173,auVar124);
        auVar24 = vfnmadd213ps_fma(auVar46,auVar173,local_2c0);
        local_460 = ZEXT1632(auVar12);
        auVar26 = vfnmadd231ps_fma(local_380,local_460,auVar47);
        auVar173 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar107));
        auVar163 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar25));
        auVar142._0_4_ = auVar25._0_4_ * auVar173._0_4_;
        auVar142._4_4_ = auVar25._4_4_ * auVar173._4_4_;
        auVar142._8_4_ = auVar25._8_4_ * auVar173._8_4_;
        auVar142._12_4_ = auVar25._12_4_ * auVar173._12_4_;
        auVar142._16_4_ = auVar173._16_4_ * 0.0;
        auVar142._20_4_ = auVar173._20_4_ * 0.0;
        auVar142._24_4_ = auVar173._24_4_ * 0.0;
        auVar142._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar142,ZEXT1632(auVar107),auVar163);
        auVar48._4_4_ = auVar17._4_4_ * auVar163._4_4_;
        auVar48._0_4_ = auVar17._0_4_ * auVar163._0_4_;
        auVar48._8_4_ = auVar17._8_4_ * auVar163._8_4_;
        auVar48._12_4_ = auVar17._12_4_ * auVar163._12_4_;
        auVar48._16_4_ = auVar163._16_4_ * 0.0;
        auVar48._20_4_ = auVar163._20_4_ * 0.0;
        auVar48._24_4_ = auVar163._24_4_ * 0.0;
        auVar48._28_4_ = auVar163._28_4_;
        auVar176 = ZEXT1632(auVar17);
        auVar163 = vsubps_avx(ZEXT1632(auVar15),auVar176);
        auVar21 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar25),auVar163);
        auVar49._4_4_ = auVar107._4_4_ * auVar163._4_4_;
        auVar49._0_4_ = auVar107._0_4_ * auVar163._0_4_;
        auVar49._8_4_ = auVar107._8_4_ * auVar163._8_4_;
        auVar49._12_4_ = auVar107._12_4_ * auVar163._12_4_;
        auVar49._16_4_ = auVar163._16_4_ * 0.0;
        auVar49._20_4_ = auVar163._20_4_ * 0.0;
        auVar49._24_4_ = auVar163._24_4_ * 0.0;
        auVar49._28_4_ = auVar163._28_4_;
        auVar17 = vfmsub231ps_fma(auVar49,auVar176,auVar173);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
        local_4c0._16_16_ = auVar129._16_16_;
        local_4c0._0_16_ = local_760._16_16_;
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar109 = vcmpps_avx(ZEXT1632(auVar21),ZEXT832(0) << 0x20,2);
        auVar173 = vblendvps_avx(ZEXT1632(auVar169),ZEXT1632(auVar10),auVar109);
        auVar163 = vblendvps_avx(ZEXT1632(auVar24),ZEXT1632(auVar13),auVar109);
        auVar129 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar14),auVar109);
        auVar186 = vblendvps_avx(auVar176,ZEXT1632(auVar15),auVar109);
        auVar141 = vblendvps_avx(ZEXT1632(auVar107),ZEXT1632(auVar16),auVar109);
        auVar117 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar11),auVar109);
        auVar176 = vblendvps_avx(ZEXT1632(auVar15),auVar176,auVar109);
        auVar131 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar107),auVar109);
        auVar21 = vpackssdw_avx(local_760._0_16_,local_760._16_16_);
        auVar148 = vblendvps_avx(ZEXT1632(auVar11),ZEXT1632(auVar25),auVar109);
        auVar124 = vsubps_avx(auVar176,auVar173);
        auVar131 = vsubps_avx(auVar131,auVar163);
        auVar140 = vsubps_avx(auVar148,auVar129);
        auVar159 = vsubps_avx(auVar173,auVar186);
        auVar171 = vsubps_avx(auVar163,auVar141);
        auVar172 = vsubps_avx(auVar129,auVar117);
        auVar50._4_4_ = auVar140._4_4_ * auVar173._4_4_;
        auVar50._0_4_ = auVar140._0_4_ * auVar173._0_4_;
        auVar50._8_4_ = auVar140._8_4_ * auVar173._8_4_;
        auVar50._12_4_ = auVar140._12_4_ * auVar173._12_4_;
        auVar50._16_4_ = auVar140._16_4_ * auVar173._16_4_;
        auVar50._20_4_ = auVar140._20_4_ * auVar173._20_4_;
        auVar50._24_4_ = auVar140._24_4_ * auVar173._24_4_;
        auVar50._28_4_ = auVar148._28_4_;
        auVar10 = vfmsub231ps_fma(auVar50,auVar129,auVar124);
        auVar51._4_4_ = auVar124._4_4_ * auVar163._4_4_;
        auVar51._0_4_ = auVar124._0_4_ * auVar163._0_4_;
        auVar51._8_4_ = auVar124._8_4_ * auVar163._8_4_;
        auVar51._12_4_ = auVar124._12_4_ * auVar163._12_4_;
        auVar51._16_4_ = auVar124._16_4_ * auVar163._16_4_;
        auVar51._20_4_ = auVar124._20_4_ * auVar163._20_4_;
        auVar51._24_4_ = auVar124._24_4_ * auVar163._24_4_;
        auVar51._28_4_ = auVar176._28_4_;
        auVar11 = vfmsub231ps_fma(auVar51,auVar173,auVar131);
        auVar164 = ZEXT3264(auVar163);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
        auVar112._0_4_ = auVar131._0_4_ * auVar129._0_4_;
        auVar112._4_4_ = auVar131._4_4_ * auVar129._4_4_;
        auVar112._8_4_ = auVar131._8_4_ * auVar129._8_4_;
        auVar112._12_4_ = auVar131._12_4_ * auVar129._12_4_;
        auVar112._16_4_ = auVar131._16_4_ * auVar129._16_4_;
        auVar112._20_4_ = auVar131._20_4_ * auVar129._20_4_;
        auVar112._24_4_ = auVar131._24_4_ * auVar129._24_4_;
        auVar112._28_4_ = 0;
        auVar11 = vfmsub231ps_fma(auVar112,auVar163,auVar140);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar113._0_4_ = auVar172._0_4_ * auVar186._0_4_;
        auVar113._4_4_ = auVar172._4_4_ * auVar186._4_4_;
        auVar113._8_4_ = auVar172._8_4_ * auVar186._8_4_;
        auVar113._12_4_ = auVar172._12_4_ * auVar186._12_4_;
        auVar113._16_4_ = auVar172._16_4_ * auVar186._16_4_;
        auVar113._20_4_ = auVar172._20_4_ * auVar186._20_4_;
        auVar113._24_4_ = auVar172._24_4_ * auVar186._24_4_;
        auVar113._28_4_ = 0;
        auVar10 = vfmsub231ps_fma(auVar113,auVar159,auVar117);
        auVar52._4_4_ = auVar171._4_4_ * auVar117._4_4_;
        auVar52._0_4_ = auVar171._0_4_ * auVar117._0_4_;
        auVar52._8_4_ = auVar171._8_4_ * auVar117._8_4_;
        auVar52._12_4_ = auVar171._12_4_ * auVar117._12_4_;
        auVar52._16_4_ = auVar171._16_4_ * auVar117._16_4_;
        auVar52._20_4_ = auVar171._20_4_ * auVar117._20_4_;
        auVar52._24_4_ = auVar171._24_4_ * auVar117._24_4_;
        auVar52._28_4_ = auVar117._28_4_;
        auVar12 = vfmsub231ps_fma(auVar52,auVar141,auVar172);
        auVar53._4_4_ = auVar159._4_4_ * auVar141._4_4_;
        auVar53._0_4_ = auVar159._0_4_ * auVar141._0_4_;
        auVar53._8_4_ = auVar159._8_4_ * auVar141._8_4_;
        auVar53._12_4_ = auVar159._12_4_ * auVar141._12_4_;
        auVar53._16_4_ = auVar159._16_4_ * auVar141._16_4_;
        auVar53._20_4_ = auVar159._20_4_ * auVar141._20_4_;
        auVar53._24_4_ = auVar159._24_4_ * auVar141._24_4_;
        auVar53._28_4_ = auVar141._28_4_;
        auVar13 = vfmsub231ps_fma(auVar53,auVar171,auVar186);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar186 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
        auVar186 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,2);
        auVar10 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
        auVar21 = vpand_avx(auVar21,auVar10);
        auVar186 = vpmovsxwd_avx2(auVar21);
        if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar186 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar186 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar186 >> 0x7f,0) == '\0') &&
              (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar186 >> 0xbf,0) == '\0') &&
            (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar186[0x1f]) {
LAB_01818d64:
          auVar168 = ZEXT3264(CONCAT824(uStack_468,
                                        CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
          auVar196 = ZEXT3264(auVar115);
          auVar187 = ZEXT3264(auVar153);
        }
        else {
          auVar54._4_4_ = auVar131._4_4_ * auVar172._4_4_;
          auVar54._0_4_ = auVar131._0_4_ * auVar172._0_4_;
          auVar54._8_4_ = auVar131._8_4_ * auVar172._8_4_;
          auVar54._12_4_ = auVar131._12_4_ * auVar172._12_4_;
          auVar54._16_4_ = auVar131._16_4_ * auVar172._16_4_;
          auVar54._20_4_ = auVar131._20_4_ * auVar172._20_4_;
          auVar54._24_4_ = auVar131._24_4_ * auVar172._24_4_;
          auVar54._28_4_ = auVar186._28_4_;
          auVar15 = vfmsub231ps_fma(auVar54,auVar171,auVar140);
          auVar127._0_4_ = auVar159._0_4_ * auVar140._0_4_;
          auVar127._4_4_ = auVar159._4_4_ * auVar140._4_4_;
          auVar127._8_4_ = auVar159._8_4_ * auVar140._8_4_;
          auVar127._12_4_ = auVar159._12_4_ * auVar140._12_4_;
          auVar127._16_4_ = auVar159._16_4_ * auVar140._16_4_;
          auVar127._20_4_ = auVar159._20_4_ * auVar140._20_4_;
          auVar127._24_4_ = auVar159._24_4_ * auVar140._24_4_;
          auVar127._28_4_ = 0;
          auVar14 = vfmsub231ps_fma(auVar127,auVar124,auVar172);
          auVar55._4_4_ = auVar124._4_4_ * auVar171._4_4_;
          auVar55._0_4_ = auVar124._0_4_ * auVar171._0_4_;
          auVar55._8_4_ = auVar124._8_4_ * auVar171._8_4_;
          auVar55._12_4_ = auVar124._12_4_ * auVar171._12_4_;
          auVar55._16_4_ = auVar124._16_4_ * auVar171._16_4_;
          auVar55._20_4_ = auVar124._20_4_ * auVar171._20_4_;
          auVar55._24_4_ = auVar124._24_4_ * auVar171._24_4_;
          auVar55._28_4_ = auVar124._28_4_;
          auVar16 = vfmsub231ps_fma(auVar55,auVar159,auVar131);
          auVar10 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar14),ZEXT1632(auVar16));
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar15),_DAT_01faff00);
          auVar186 = vrcpps_avx(ZEXT1632(auVar13));
          auVar195._8_4_ = 0x3f800000;
          auVar195._0_8_ = 0x3f8000003f800000;
          auVar195._12_4_ = 0x3f800000;
          auVar195._16_4_ = 0x3f800000;
          auVar195._20_4_ = 0x3f800000;
          auVar195._24_4_ = 0x3f800000;
          auVar195._28_4_ = 0x3f800000;
          auVar10 = vfnmadd213ps_fma(auVar186,ZEXT1632(auVar13),auVar195);
          auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar186,auVar186);
          auVar56._4_4_ = auVar16._4_4_ * auVar129._4_4_;
          auVar56._0_4_ = auVar16._0_4_ * auVar129._0_4_;
          auVar56._8_4_ = auVar16._8_4_ * auVar129._8_4_;
          auVar56._12_4_ = auVar16._12_4_ * auVar129._12_4_;
          auVar56._16_4_ = auVar129._16_4_ * 0.0;
          auVar56._20_4_ = auVar129._20_4_ * 0.0;
          auVar56._24_4_ = auVar129._24_4_ * 0.0;
          auVar56._28_4_ = auVar129._28_4_;
          auVar14 = vfmadd231ps_fma(auVar56,auVar163,ZEXT1632(auVar14));
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar15),auVar173);
          fVar118 = auVar10._0_4_;
          fVar119 = auVar10._4_4_;
          fVar120 = auVar10._8_4_;
          fVar121 = auVar10._12_4_;
          auVar57._28_4_ = auVar163._28_4_;
          auVar57._0_28_ =
               ZEXT1628(CONCAT412(fVar121 * auVar14._12_4_,
                                  CONCAT48(fVar120 * auVar14._8_4_,
                                           CONCAT44(fVar119 * auVar14._4_4_,fVar118 * auVar14._0_4_)
                                          )));
          auVar164 = ZEXT3264(auVar57);
          auVar10 = vpermilps_avx((undefined1  [16])aVar7,0xff);
          auVar114._0_8_ = auVar10._0_8_;
          auVar114._8_8_ = auVar114._0_8_;
          auVar114._16_8_ = auVar114._0_8_;
          auVar114._24_8_ = auVar114._0_8_;
          fVar135 = ray->tfar;
          auVar128._4_4_ = fVar135;
          auVar128._0_4_ = fVar135;
          auVar128._8_4_ = fVar135;
          auVar128._12_4_ = fVar135;
          auVar128._16_4_ = fVar135;
          auVar128._20_4_ = fVar135;
          auVar128._24_4_ = fVar135;
          auVar128._28_4_ = fVar135;
          auVar163 = vcmpps_avx(auVar114,auVar57,2);
          auVar129 = vcmpps_avx(auVar57,auVar128,2);
          auVar163 = vandps_avx(auVar129,auVar163);
          auVar10 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
          auVar21 = vpand_avx(auVar21,auVar10);
          auVar163 = vpmovsxwd_avx2(auVar21);
          if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar163 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar163 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar163 >> 0x7f,0) == '\0') &&
                (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar163 >> 0xbf,0) == '\0') &&
              (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar163[0x1f]) goto LAB_01818d64;
          auVar163 = vcmpps_avx(ZEXT1632(auVar13),ZEXT832(0) << 0x20,4);
          auVar10 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
          auVar21 = vpand_avx(auVar21,auVar10);
          auVar163 = vpmovsxwd_avx2(auVar21);
          auVar168 = ZEXT3264(CONCAT824(uStack_468,
                                        CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
          auVar196 = ZEXT3264(auVar115);
          auVar187 = ZEXT3264(auVar153);
          if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar163 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar163 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar163 >> 0x7f,0) != '\0') ||
                (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar163 >> 0xbf,0) != '\0') ||
              (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar163[0x1f] < '\0') {
            auVar115 = ZEXT1632(CONCAT412(fVar121 * auVar11._12_4_,
                                          CONCAT48(fVar120 * auVar11._8_4_,
                                                   CONCAT44(fVar119 * auVar11._4_4_,
                                                            fVar118 * auVar11._0_4_))));
            auVar129 = ZEXT1632(CONCAT412(fVar121 * auVar12._12_4_,
                                          CONCAT48(fVar120 * auVar12._8_4_,
                                                   CONCAT44(fVar119 * auVar12._4_4_,
                                                            fVar118 * auVar12._0_4_))));
            auVar152._8_4_ = 0x3f800000;
            auVar152._0_8_ = 0x3f8000003f800000;
            auVar152._12_4_ = 0x3f800000;
            auVar152._16_4_ = 0x3f800000;
            auVar152._20_4_ = 0x3f800000;
            auVar152._24_4_ = 0x3f800000;
            auVar152._28_4_ = 0x3f800000;
            auVar153 = vsubps_avx(auVar152,auVar115);
            auVar153 = vblendvps_avx(auVar153,auVar115,auVar109);
            auVar196 = ZEXT3264(auVar153);
            auVar153 = vsubps_avx(auVar152,auVar129);
            local_3a0 = vblendvps_avx(auVar153,auVar129,auVar109);
            auVar168 = ZEXT3264(auVar163);
            auVar187 = ZEXT3264(auVar57);
          }
        }
        auVar210 = ZEXT3264(local_6e0);
        auVar206 = ZEXT3264(local_6c0);
        auVar199 = ZEXT3264(_local_500);
        auVar190 = ZEXT3264(local_700);
        auVar153 = auVar168._0_32_;
        if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar153 >> 0x7f,0) == '\0') &&
              (auVar168 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar153 >> 0xbf,0) == '\0') &&
            (auVar168 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar168[0x1f]) goto LAB_01817b02;
        auVar115 = vsubps_avx(local_460,local_440);
        local_260 = auVar196._0_32_;
        auVar21 = vfmadd213ps_fma(auVar115,local_260,local_440);
        fVar135 = local_688->depth_scale;
        auVar115._4_4_ = (auVar21._4_4_ + auVar21._4_4_) * fVar135;
        auVar115._0_4_ = (auVar21._0_4_ + auVar21._0_4_) * fVar135;
        auVar115._8_4_ = (auVar21._8_4_ + auVar21._8_4_) * fVar135;
        auVar115._12_4_ = (auVar21._12_4_ + auVar21._12_4_) * fVar135;
        auVar115._16_4_ = fVar135 * 0.0;
        auVar115._20_4_ = fVar135 * 0.0;
        auVar115._24_4_ = fVar135 * 0.0;
        auVar115._28_4_ = 0;
        local_220 = auVar187._0_32_;
        auVar115 = vcmpps_avx(local_220,auVar115,6);
        auVar163 = auVar153 & auVar115;
        auVar168 = ZEXT3264(local_620);
        auVar174 = ZEXT3264(CONCAT428(local_640,
                                      CONCAT424(local_640,
                                                CONCAT420(local_640,
                                                          CONCAT416(local_640,
                                                                    CONCAT412(local_640,
                                                                              CONCAT48(local_640,
                                                                                       CONCAT44(
                                                  local_640,local_640))))))));
        auVar178 = ZEXT3264(local_660);
        if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar163 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar163 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar163 >> 0x7f,0) != '\0') ||
              (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar163 >> 0xbf,0) != '\0') ||
            (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar163[0x1f] < '\0') {
          auVar130._8_4_ = 0xbf800000;
          auVar130._0_8_ = 0xbf800000bf800000;
          auVar130._12_4_ = 0xbf800000;
          auVar130._16_4_ = 0xbf800000;
          auVar130._20_4_ = 0xbf800000;
          auVar130._24_4_ = 0xbf800000;
          auVar130._28_4_ = 0xbf800000;
          auVar143._8_4_ = 0x40000000;
          auVar143._0_8_ = 0x4000000040000000;
          auVar143._12_4_ = 0x40000000;
          auVar143._16_4_ = 0x40000000;
          auVar143._20_4_ = 0x40000000;
          auVar143._24_4_ = 0x40000000;
          auVar143._28_4_ = 0x40000000;
          auVar21 = vfmadd213ps_fma(local_3a0,auVar143,auVar130);
          local_3a0 = ZEXT1632(auVar21);
          auVar163 = local_3a0;
          local_240 = ZEXT1632(auVar21);
          local_200 = 0;
          local_1fc = iVar19;
          local_1f0 = *(undefined8 *)*pauVar1;
          uStack_1e8 = *(undefined8 *)(*pauVar1 + 8);
          local_1e0 = *(undefined8 *)*pauVar2;
          uStack_1d8 = *(undefined8 *)(*pauVar2 + 8);
          local_1d0 = *(undefined8 *)*pauVar3;
          uStack_1c8 = *(undefined8 *)(*pauVar3 + 8);
          if ((pGVar100->mask & ray->mask) != 0) {
            auVar134 = ZEXT3264(local_740);
            auVar151 = ZEXT3264(local_4e0);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar103 = true, pGVar100->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar153 = vandps_avx(auVar115,auVar153);
              fVar135 = 1.0 / (float)local_400._0_4_;
              local_180[0] = fVar135 * (auVar196._0_4_ + 0.0);
              local_180[1] = fVar135 * (auVar196._4_4_ + 1.0);
              local_180[2] = fVar135 * (auVar196._8_4_ + 2.0);
              local_180[3] = fVar135 * (auVar196._12_4_ + 3.0);
              fStack_170 = fVar135 * (auVar196._16_4_ + 4.0);
              fStack_16c = fVar135 * (auVar196._20_4_ + 5.0);
              fStack_168 = fVar135 * (auVar196._24_4_ + 6.0);
              fStack_164 = auVar196._28_4_ + 7.0;
              local_3a0._0_8_ = auVar21._0_8_;
              local_3a0._8_8_ = auVar21._8_8_;
              local_160 = local_3a0._0_8_;
              uStack_158 = local_3a0._8_8_;
              uStack_150 = 0;
              uStack_148 = 0;
              local_140 = local_220;
              uVar98 = vmovmskps_avx(auVar153);
              local_3a0 = auVar163;
              if (uVar98 == 0) goto LAB_01817bd8;
              uVar99 = CONCAT44(0,uVar98 & 0xff);
              local_7a0._8_24_ = auVar173._8_24_;
              local_7a0._0_8_ = uVar99;
              lVar101 = 0;
              for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
                lVar101 = lVar101 + 1;
              }
              local_4c0._0_4_ = ray->tfar;
              local_680 = local_260;
              local_720 = local_220;
              do {
                local_534 = local_180[lVar101];
                local_530 = *(undefined4 *)((long)&local_160 + lVar101 * 4);
                local_760._0_8_ = lVar101;
                ray->tfar = *(float *)(local_140 + lVar101 * 4);
                local_5d0.context = context->user;
                fVar118 = 1.0 - local_534;
                fVar135 = fVar118 * fVar118 * -3.0;
                auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar118 * fVar118)),
                                          ZEXT416((uint)(local_534 * fVar118)),ZEXT416(0xc0000000));
                auVar10 = vfmsub132ss_fma(ZEXT416((uint)(local_534 * fVar118)),
                                          ZEXT416((uint)(local_534 * local_534)),ZEXT416(0x40000000)
                                         );
                fVar118 = auVar21._0_4_ * 3.0;
                fVar119 = auVar10._0_4_ * 3.0;
                fVar120 = local_534 * local_534 * 3.0;
                auVar157._0_4_ = fVar120 * local_490;
                auVar157._4_4_ = fVar120 * fStack_48c;
                auVar157._8_4_ = fVar120 * fStack_488;
                auVar157._12_4_ = fVar120 * fStack_484;
                auVar164 = ZEXT1664(auVar157);
                auVar136._4_4_ = fVar119;
                auVar136._0_4_ = fVar119;
                auVar136._8_4_ = fVar119;
                auVar136._12_4_ = fVar119;
                auVar90._8_8_ = uStack_5f8;
                auVar90._0_8_ = local_600;
                auVar21 = vfmadd132ps_fma(auVar136,auVar157,auVar90);
                auVar146._4_4_ = fVar118;
                auVar146._0_4_ = fVar118;
                auVar146._8_4_ = fVar118;
                auVar146._12_4_ = fVar118;
                auVar92._8_8_ = uStack_5e8;
                auVar92._0_8_ = local_5f0;
                auVar21 = vfmadd132ps_fma(auVar146,auVar21,auVar92);
                auVar137._4_4_ = fVar135;
                auVar137._0_4_ = fVar135;
                auVar137._8_4_ = fVar135;
                auVar137._12_4_ = fVar135;
                auVar94._8_8_ = uStack_5d8;
                auVar94._0_8_ = local_5e0;
                auVar21 = vfmadd132ps_fma(auVar137,auVar21,auVar94);
                local_540 = vmovlps_avx(auVar21);
                local_538 = vextractps_avx(auVar21,2);
                local_52c = (int)local_508;
                local_528 = (int)local_690;
                local_524 = (local_5d0.context)->instID[0];
                local_520 = (local_5d0.context)->instPrimID[0];
                local_7ac = -1;
                local_5d0.valid = &local_7ac;
                local_5d0.geometryUserPtr = pGVar100->userPtr;
                local_5d0.ray = (RTCRayN *)ray;
                local_5d0.hit = (RTCHitN *)&local_540;
                local_5d0.N = 1;
                if (pGVar100->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01817eb0:
                  p_Var20 = context->args->filter;
                  if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar100->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar164 = ZEXT1664(auVar164._0_16_);
                    (*p_Var20)(&local_5d0);
                    if (*local_5d0.valid == 0) goto LAB_01817ef4;
                  }
                  bVar103 = true;
                  auVar196 = ZEXT3264(local_680);
                  auVar134 = ZEXT3264(local_740);
                  auVar187 = ZEXT3264(local_720);
                  auVar190 = ZEXT3264(local_700);
                  auVar206 = ZEXT3264(local_6c0);
                  auVar210 = ZEXT3264(local_6e0);
                  auVar168 = ZEXT3264(local_620);
                  auVar174 = ZEXT3264(CONCAT428(fStack_624,
                                                CONCAT424(fStack_628,
                                                          CONCAT420(fStack_62c,
                                                                    CONCAT416(fStack_630,
                                                                              CONCAT412(fStack_634,
                                                                                        CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                  auVar178 = ZEXT3264(local_660);
                  auVar151 = ZEXT3264(local_4e0);
                  auVar199 = ZEXT3264(_local_500);
                  break;
                }
                auVar164 = ZEXT1664(auVar157);
                (*pGVar100->occlusionFilterN)(&local_5d0);
                if (*local_5d0.valid != 0) goto LAB_01817eb0;
LAB_01817ef4:
                ray->tfar = (float)local_4c0._0_4_;
                uVar102 = local_7a0._0_8_ ^ 1L << (local_760._0_8_ & 0x3f);
                bVar103 = false;
                local_7a0._0_8_ = uVar102;
                lVar101 = 0;
                for (uVar99 = uVar102; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000)
                {
                  lVar101 = lVar101 + 1;
                }
                auVar196 = ZEXT3264(local_680);
                auVar134 = ZEXT3264(local_740);
                auVar187 = ZEXT3264(local_720);
                auVar190 = ZEXT3264(local_700);
                auVar206 = ZEXT3264(local_6c0);
                auVar210 = ZEXT3264(local_6e0);
                auVar168 = ZEXT3264(local_620);
                auVar174 = ZEXT3264(CONCAT428(fStack_624,
                                              CONCAT424(fStack_628,
                                                        CONCAT420(fStack_62c,
                                                                  CONCAT416(fStack_630,
                                                                            CONCAT412(fStack_634,
                                                                                      CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                auVar178 = ZEXT3264(local_660);
                auVar151 = ZEXT3264(local_4e0);
                auVar199 = ZEXT3264(_local_500);
              } while (uVar102 != 0);
            }
            goto LAB_01817b26;
          }
          goto LAB_01817b1d;
        }
LAB_01817bd8:
        auVar151 = ZEXT3264(local_4e0);
        bVar103 = false;
        auVar134 = ZEXT3264(local_740);
      }
LAB_01817b26:
      local_740 = auVar134._0_32_;
      local_7a0._0_8_ = context;
      if (8 < iVar19) {
        _local_500 = auVar199._0_32_;
        local_320._4_4_ = iVar19;
        local_320._0_4_ = iVar19;
        local_320._8_4_ = iVar19;
        local_320._12_4_ = iVar19;
        local_320._16_4_ = iVar19;
        local_320._20_4_ = iVar19;
        local_320._24_4_ = iVar19;
        local_320._28_4_ = iVar19;
        local_380._4_4_ = local_780._0_4_;
        local_380._0_4_ = local_780._0_4_;
        local_380._8_4_ = local_780._0_4_;
        local_380._12_4_ = local_780._0_4_;
        local_380._16_4_ = local_780._0_4_;
        local_380._20_4_ = local_780._0_4_;
        local_380._24_4_ = local_780._0_4_;
        local_380._28_4_ = local_780._0_4_;
        auVar21 = vpermilps_avx(local_5a0._0_16_,0xff);
        local_120 = auVar21._0_8_;
        uStack_118 = local_120;
        uStack_110 = local_120;
        uStack_108 = local_120;
        local_400._4_4_ = 1.0 / (float)local_400._0_4_;
        local_400._0_4_ = local_400._4_4_;
        fStack_3f8 = (float)local_400._4_4_;
        fStack_3f4 = (float)local_400._4_4_;
        fStack_3f0 = (float)local_400._4_4_;
        fStack_3ec = (float)local_400._4_4_;
        fStack_3e8 = (float)local_400._4_4_;
        fStack_3e4 = (float)local_400._4_4_;
        lVar101 = 8;
        local_680 = auVar196._0_32_;
        local_720 = auVar187._0_32_;
        fVar135 = (float)local_560;
        fVar118 = local_560._4_4_;
        fVar119 = (float)uStack_558;
        fVar120 = uStack_558._4_4_;
        fVar121 = (float)uStack_550;
        fVar122 = uStack_550._4_4_;
        fVar123 = (float)uStack_548;
        uVar105 = uStack_548._4_4_;
        do {
          auVar109 = auVar190._0_32_;
          local_740 = auVar134._0_32_;
          auVar153 = *(undefined1 (*) [32])(bezier_basis0 + lVar101 * 4 + lVar22);
          local_780 = *(undefined1 (*) [32])(lVar22 + 0x21aa768 + lVar101 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar22 + 0x21aabec + lVar101 * 4);
          pfVar5 = (float *)(lVar22 + 0x21ab070 + lVar101 * 4);
          local_300 = *pfVar5;
          fStack_2fc = pfVar5[1];
          fStack_2f8 = pfVar5[2];
          fStack_2f4 = pfVar5[3];
          fStack_2f0 = pfVar5[4];
          fStack_2ec = pfVar5[5];
          fStack_2e8 = pfVar5[6];
          auVar134._0_4_ = local_300 * auVar174._0_4_;
          auVar134._4_4_ = fStack_2fc * auVar174._4_4_;
          auVar134._8_4_ = fStack_2f8 * auVar174._8_4_;
          auVar134._12_4_ = fStack_2f4 * auVar174._12_4_;
          auVar134._16_4_ = fStack_2f0 * auVar174._16_4_;
          auVar134._20_4_ = fStack_2ec * auVar174._20_4_;
          auVar134._28_36_ = auVar199._28_36_;
          auVar134._24_4_ = fStack_2e8 * auVar174._24_4_;
          auVar199._0_4_ = local_300 * fVar135;
          auVar199._4_4_ = fStack_2fc * fVar118;
          auVar199._8_4_ = fStack_2f8 * fVar119;
          auVar199._12_4_ = fStack_2f4 * fVar120;
          auVar199._16_4_ = fStack_2f0 * fVar121;
          auVar199._20_4_ = fStack_2ec * fVar122;
          auVar199._28_36_ = auVar164._28_36_;
          auVar199._24_4_ = fStack_2e8 * fVar123;
          auVar21 = vfmadd231ps_fma(auVar134._0_32_,auVar115,auVar210._0_32_);
          auVar10 = vfmadd231ps_fma(auVar199._0_32_,auVar115,auVar168._0_32_);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_780,auVar178._0_32_);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),local_780,auVar206._0_32_);
          auVar148 = auVar151._0_32_;
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar153,auVar148);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar153,local_420);
          auVar173 = *(undefined1 (*) [32])(bezier_basis1 + lVar101 * 4 + lVar22);
          auVar163 = *(undefined1 (*) [32])(lVar22 + 0x21acb88 + lVar101 * 4);
          auVar129 = *(undefined1 (*) [32])(lVar22 + 0x21ad00c + lVar101 * 4);
          pfVar6 = (float *)(lVar22 + 0x21ad490 + lVar101 * 4);
          fVar188 = *pfVar6;
          fVar175 = pfVar6[1];
          fVar179 = pfVar6[2];
          fVar180 = pfVar6[3];
          fVar181 = pfVar6[4];
          fVar191 = pfVar6[5];
          fVar192 = pfVar6[6];
          auVar164._0_4_ = fVar188 * auVar174._0_4_;
          auVar164._4_4_ = fVar175 * auVar174._4_4_;
          auVar164._8_4_ = fVar179 * auVar174._8_4_;
          auVar164._12_4_ = fVar180 * auVar174._12_4_;
          auVar164._16_4_ = fVar181 * auVar174._16_4_;
          auVar164._20_4_ = fVar191 * auVar174._20_4_;
          auVar164._28_36_ = auVar174._28_36_;
          auVar164._24_4_ = fVar192 * auVar174._24_4_;
          auVar58._4_4_ = fVar175 * fVar118;
          auVar58._0_4_ = fVar188 * fVar135;
          auVar58._8_4_ = fVar179 * fVar119;
          auVar58._12_4_ = fVar180 * fVar120;
          auVar58._16_4_ = fVar181 * fVar121;
          auVar58._20_4_ = fVar191 * fVar122;
          auVar58._24_4_ = fVar192 * fVar123;
          auVar58._28_4_ = uVar105;
          auVar11 = vfmadd231ps_fma(auVar164._0_32_,auVar129,auVar210._0_32_);
          auVar12 = vfmadd231ps_fma(auVar58,auVar129,auVar168._0_32_);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar163,auVar178._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar163,auVar206._0_32_);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar173,auVar148);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar173,local_420);
          local_2c0 = ZEXT1632(auVar11);
          local_2e0 = ZEXT1632(auVar21);
          auVar141 = vsubps_avx(local_2c0,local_2e0);
          auVar131 = ZEXT1632(auVar12);
          local_440 = ZEXT1632(auVar10);
          local_460 = vsubps_avx(auVar131,local_440);
          auVar87._4_4_ = auVar141._4_4_ * auVar10._4_4_;
          auVar87._0_4_ = auVar141._0_4_ * auVar10._0_4_;
          auVar87._8_4_ = auVar141._8_4_ * auVar10._8_4_;
          auVar87._12_4_ = auVar141._12_4_ * auVar10._12_4_;
          auVar87._16_4_ = auVar141._16_4_ * 0.0;
          auVar87._20_4_ = auVar141._20_4_ * 0.0;
          auVar87._24_4_ = auVar141._24_4_ * 0.0;
          auVar87._28_4_ = local_420._28_4_;
          auVar164 = ZEXT3264(auVar115);
          fVar135 = local_460._0_4_;
          auVar132._0_4_ = auVar21._0_4_ * fVar135;
          fVar118 = local_460._4_4_;
          auVar132._4_4_ = auVar21._4_4_ * fVar118;
          fVar119 = local_460._8_4_;
          auVar132._8_4_ = auVar21._8_4_ * fVar119;
          fVar120 = local_460._12_4_;
          auVar132._12_4_ = auVar21._12_4_ * fVar120;
          fVar121 = local_460._16_4_;
          auVar132._16_4_ = fVar121 * 0.0;
          fVar122 = local_460._20_4_;
          auVar132._20_4_ = fVar122 * 0.0;
          fVar123 = local_460._24_4_;
          auVar132._24_4_ = fVar123 * 0.0;
          auVar132._28_4_ = 0;
          auVar199 = ZEXT3264(auVar148);
          auVar117 = vsubps_avx(auVar87,auVar132);
          fStack_2e4 = pfVar5[7];
          auVar206._0_4_ = local_300 * (float)local_100;
          auVar206._4_4_ = fStack_2fc * local_100._4_4_;
          auVar206._8_4_ = fStack_2f8 * (float)uStack_f8;
          auVar206._12_4_ = fStack_2f4 * uStack_f8._4_4_;
          auVar206._16_4_ = fStack_2f0 * (float)uStack_f0;
          auVar206._20_4_ = fStack_2ec * uStack_f0._4_4_;
          auVar206._28_36_ = auVar168._28_36_;
          auVar206._24_4_ = fStack_2e8 * (float)uStack_e8;
          auVar21 = vfmadd231ps_fma(auVar206._0_32_,auVar115,local_e0);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_c0,local_780);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_a0,auVar153);
          auVar59._4_4_ = fVar175 * local_100._4_4_;
          auVar59._0_4_ = fVar188 * (float)local_100;
          auVar59._8_4_ = fVar179 * (float)uStack_f8;
          auVar59._12_4_ = fVar180 * uStack_f8._4_4_;
          auVar59._16_4_ = fVar181 * (float)uStack_f0;
          auVar59._20_4_ = fVar191 * uStack_f0._4_4_;
          auVar59._24_4_ = fVar192 * (float)uStack_e8;
          auVar59._28_4_ = uStack_e8._4_4_;
          auVar10 = vfmadd231ps_fma(auVar59,auVar129,local_e0);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar163,local_c0);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar173,local_a0);
          auVar60._4_4_ = fVar118 * fVar118;
          auVar60._0_4_ = fVar135 * fVar135;
          auVar60._8_4_ = fVar119 * fVar119;
          auVar60._12_4_ = fVar120 * fVar120;
          auVar60._16_4_ = fVar121 * fVar121;
          auVar60._20_4_ = fVar122 * fVar122;
          auVar60._24_4_ = fVar123 * fVar123;
          auVar60._28_4_ = local_a0._28_4_;
          auVar11 = vfmadd231ps_fma(auVar60,auVar141,auVar141);
          auVar186 = vmaxps_avx(ZEXT1632(auVar21),ZEXT1632(auVar10));
          auVar184._0_4_ = auVar186._0_4_ * auVar186._0_4_ * auVar11._0_4_;
          auVar184._4_4_ = auVar186._4_4_ * auVar186._4_4_ * auVar11._4_4_;
          auVar184._8_4_ = auVar186._8_4_ * auVar186._8_4_ * auVar11._8_4_;
          auVar184._12_4_ = auVar186._12_4_ * auVar186._12_4_ * auVar11._12_4_;
          auVar184._16_4_ = auVar186._16_4_ * auVar186._16_4_ * 0.0;
          auVar184._20_4_ = auVar186._20_4_ * auVar186._20_4_ * 0.0;
          auVar184._24_4_ = auVar186._24_4_ * auVar186._24_4_ * 0.0;
          auVar184._28_4_ = 0;
          auVar61._4_4_ = auVar117._4_4_ * auVar117._4_4_;
          auVar61._0_4_ = auVar117._0_4_ * auVar117._0_4_;
          auVar61._8_4_ = auVar117._8_4_ * auVar117._8_4_;
          auVar61._12_4_ = auVar117._12_4_ * auVar117._12_4_;
          auVar61._16_4_ = auVar117._16_4_ * auVar117._16_4_;
          auVar61._20_4_ = auVar117._20_4_ * auVar117._20_4_;
          auVar61._24_4_ = auVar117._24_4_ * auVar117._24_4_;
          auVar61._28_4_ = auVar117._28_4_;
          auVar186 = vcmpps_avx(auVar61,auVar184,2);
          local_200 = (int)lVar101;
          auVar185._4_4_ = local_200;
          auVar185._0_4_ = local_200;
          auVar185._8_4_ = local_200;
          auVar185._12_4_ = local_200;
          auVar185._16_4_ = local_200;
          auVar185._20_4_ = local_200;
          auVar185._24_4_ = local_200;
          auVar185._28_4_ = local_200;
          auVar117 = vpor_avx2(auVar185,_DAT_01fe9900);
          auVar176 = vpcmpgtd_avx2(local_320,auVar117);
          auVar117 = auVar176 & auVar186;
          local_7a0._0_8_ = context;
          fVar135 = (float)local_560;
          fVar118 = local_560._4_4_;
          fVar119 = (float)uStack_558;
          fVar120 = uStack_558._4_4_;
          fVar121 = (float)uStack_550;
          fVar122 = uStack_550._4_4_;
          fVar123 = (float)uStack_548;
          uVar105 = uStack_548._4_4_;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar117 >> 0x7f,0) == '\0') &&
                (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0xbf,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar117[0x1f]) {
            auVar190 = ZEXT3264(auVar109);
LAB_018187fe:
            auVar210 = ZEXT3264(local_6e0);
            auVar206 = ZEXT3264(local_6c0);
            auVar187 = ZEXT3264(local_720);
            auVar134 = ZEXT3264(local_740);
            auVar168 = ZEXT3264(local_620);
            auVar174 = ZEXT3264(CONCAT428(fStack_624,
                                          CONCAT424(fStack_628,
                                                    CONCAT420(fStack_62c,
                                                              CONCAT416(fStack_630,
                                                                        CONCAT412(fStack_634,
                                                                                  CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
            auVar178 = ZEXT3264(local_660);
          }
          else {
            local_340 = vandps_avx(auVar176,auVar186);
            auVar62._4_4_ = (float)local_500._4_4_ * fVar175;
            auVar62._0_4_ = (float)local_500._0_4_ * fVar188;
            auVar62._8_4_ = fStack_4f8 * fVar179;
            auVar62._12_4_ = fStack_4f4 * fVar180;
            auVar62._16_4_ = fStack_4f0 * fVar181;
            auVar62._20_4_ = fStack_4ec * fVar191;
            auVar62._24_4_ = fStack_4e8 * fVar192;
            auVar62._28_4_ = auVar186._28_4_;
            auVar11 = vfmadd213ps_fma(auVar129,local_3e0,auVar62);
            auVar11 = vfmadd213ps_fma(auVar163,local_580,ZEXT1632(auVar11));
            auVar11 = vfmadd132ps_fma(auVar173,ZEXT1632(auVar11),local_360);
            auVar63._4_4_ = (float)local_500._4_4_ * fStack_2fc;
            auVar63._0_4_ = (float)local_500._0_4_ * local_300;
            auVar63._8_4_ = fStack_4f8 * fStack_2f8;
            auVar63._12_4_ = fStack_4f4 * fStack_2f4;
            auVar63._16_4_ = fStack_4f0 * fStack_2f0;
            auVar63._20_4_ = fStack_4ec * fStack_2ec;
            auVar63._24_4_ = fStack_4e8 * fStack_2e8;
            auVar63._28_4_ = auVar186._28_4_;
            auVar13 = vfmadd213ps_fma(auVar115,local_3e0,auVar63);
            auVar13 = vfmadd213ps_fma(local_780,local_580,ZEXT1632(auVar13));
            auVar115 = *(undefined1 (*) [32])(lVar22 + 0x21ab4f4 + lVar101 * 4);
            auVar173 = *(undefined1 (*) [32])(lVar22 + 0x21ab978 + lVar101 * 4);
            auVar163 = *(undefined1 (*) [32])(lVar22 + 0x21abdfc + lVar101 * 4);
            pfVar5 = (float *)(lVar22 + 0x21ac280 + lVar101 * 4);
            fVar188 = *pfVar5;
            fVar175 = pfVar5[1];
            fVar179 = pfVar5[2];
            fVar180 = pfVar5[3];
            fVar181 = pfVar5[4];
            fVar191 = pfVar5[5];
            fVar192 = pfVar5[6];
            auVar64._4_4_ = fStack_63c * fVar175;
            auVar64._0_4_ = local_640 * fVar188;
            auVar64._8_4_ = fStack_638 * fVar179;
            auVar64._12_4_ = fStack_634 * fVar180;
            auVar64._16_4_ = fStack_630 * fVar181;
            auVar64._20_4_ = fStack_62c * fVar191;
            auVar64._24_4_ = fStack_628 * fVar192;
            auVar64._28_4_ = auVar141._28_4_;
            auVar65._4_4_ = local_560._4_4_ * fVar175;
            auVar65._0_4_ = (float)local_560 * fVar188;
            auVar65._8_4_ = (float)uStack_558 * fVar179;
            auVar65._12_4_ = uStack_558._4_4_ * fVar180;
            auVar65._16_4_ = (float)uStack_550 * fVar181;
            auVar65._20_4_ = uStack_550._4_4_ * fVar191;
            auVar65._24_4_ = (float)uStack_548 * fVar192;
            auVar65._28_4_ = auVar151._28_4_;
            auVar66._4_4_ = (float)local_500._4_4_ * fVar175;
            auVar66._0_4_ = (float)local_500._0_4_ * fVar188;
            auVar66._8_4_ = fStack_4f8 * fVar179;
            auVar66._12_4_ = fStack_4f4 * fVar180;
            auVar66._16_4_ = fStack_4f0 * fVar181;
            auVar66._20_4_ = fStack_4ec * fVar191;
            auVar66._24_4_ = fStack_4e8 * fVar192;
            auVar66._28_4_ = pfVar5[7];
            auVar14 = vfmadd231ps_fma(auVar64,auVar163,local_6e0);
            auVar15 = vfmadd231ps_fma(auVar65,auVar163,local_620);
            auVar16 = vfmadd231ps_fma(auVar66,local_3e0,auVar163);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar173,local_660);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar173,local_6c0);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar173,local_580);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar115,auVar148);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar115,local_420);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar115,local_360);
            pfVar5 = (float *)(lVar22 + 0x21ae6a0 + lVar101 * 4);
            fVar188 = *pfVar5;
            fVar175 = pfVar5[1];
            fVar179 = pfVar5[2];
            fVar180 = pfVar5[3];
            fVar181 = pfVar5[4];
            fVar191 = pfVar5[5];
            fVar192 = pfVar5[6];
            auVar67._4_4_ = fStack_63c * fVar175;
            auVar67._0_4_ = local_640 * fVar188;
            auVar67._8_4_ = fStack_638 * fVar179;
            auVar67._12_4_ = fStack_634 * fVar180;
            auVar67._16_4_ = fStack_630 * fVar181;
            auVar67._20_4_ = fStack_62c * fVar191;
            auVar67._24_4_ = fStack_628 * fVar192;
            auVar67._28_4_ = fStack_624;
            auVar68._4_4_ = local_560._4_4_ * fVar175;
            auVar68._0_4_ = (float)local_560 * fVar188;
            auVar68._8_4_ = (float)uStack_558 * fVar179;
            auVar68._12_4_ = uStack_558._4_4_ * fVar180;
            auVar68._16_4_ = (float)uStack_550 * fVar181;
            auVar68._20_4_ = uStack_550._4_4_ * fVar191;
            auVar68._24_4_ = (float)uStack_548 * fVar192;
            auVar68._28_4_ = uStack_548._4_4_;
            auVar69._4_4_ = (float)local_500._4_4_ * fVar175;
            auVar69._0_4_ = (float)local_500._0_4_ * fVar188;
            auVar69._8_4_ = fStack_4f8 * fVar179;
            auVar69._12_4_ = fStack_4f4 * fVar180;
            auVar69._16_4_ = fStack_4f0 * fVar181;
            auVar69._20_4_ = fStack_4ec * fVar191;
            auVar69._24_4_ = fStack_4e8 * fVar192;
            auVar69._28_4_ = pfVar5[7];
            auVar115 = *(undefined1 (*) [32])(lVar22 + 0x21ae21c + lVar101 * 4);
            auVar17 = vfmadd231ps_fma(auVar67,auVar115,local_6e0);
            auVar107 = vfmadd231ps_fma(auVar68,auVar115,local_620);
            auVar169 = vfmadd231ps_fma(auVar69,local_3e0,auVar115);
            auVar115 = *(undefined1 (*) [32])(lVar22 + 0x21add98 + lVar101 * 4);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar115,local_660);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar115,local_6c0);
            auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar115,local_580);
            auVar115 = *(undefined1 (*) [32])(lVar22 + 0x21ad914 + lVar101 * 4);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar115,auVar148);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar115,local_420);
            auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),local_360,auVar115);
            auVar115 = vandps_avx(ZEXT1632(auVar14),local_280);
            auVar173 = vandps_avx(ZEXT1632(auVar15),local_280);
            auVar173 = vmaxps_avx(auVar115,auVar173);
            auVar115 = vandps_avx(ZEXT1632(auVar16),local_280);
            auVar115 = vmaxps_avx(auVar173,auVar115);
            auVar115 = vcmpps_avx(auVar115,local_380,1);
            auVar163 = vblendvps_avx(ZEXT1632(auVar14),auVar141,auVar115);
            auVar129 = vblendvps_avx(ZEXT1632(auVar15),local_460,auVar115);
            auVar115 = vandps_avx(ZEXT1632(auVar17),local_280);
            auVar173 = vandps_avx(ZEXT1632(auVar107),local_280);
            auVar173 = vmaxps_avx(auVar115,auVar173);
            auVar115 = vandps_avx(local_280,ZEXT1632(auVar169));
            auVar115 = vmaxps_avx(auVar173,auVar115);
            auVar173 = vcmpps_avx(auVar115,local_380,1);
            auVar115 = vblendvps_avx(ZEXT1632(auVar17),auVar141,auVar173);
            auVar173 = vblendvps_avx(ZEXT1632(auVar107),local_460,auVar173);
            auVar13 = vfmadd213ps_fma(auVar153,local_360,ZEXT1632(auVar13));
            auVar14 = vfmadd213ps_fma(auVar163,auVar163,ZEXT832(0) << 0x20);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar129,auVar129);
            auVar153 = vrsqrtps_avx(ZEXT1632(auVar14));
            fVar188 = auVar153._0_4_;
            fVar175 = auVar153._4_4_;
            fVar179 = auVar153._8_4_;
            fVar180 = auVar153._12_4_;
            fVar181 = auVar153._16_4_;
            fVar191 = auVar153._20_4_;
            fVar192 = auVar153._24_4_;
            auVar70._4_4_ = fVar175 * fVar175 * fVar175 * auVar14._4_4_ * -0.5;
            auVar70._0_4_ = fVar188 * fVar188 * fVar188 * auVar14._0_4_ * -0.5;
            auVar70._8_4_ = fVar179 * fVar179 * fVar179 * auVar14._8_4_ * -0.5;
            auVar70._12_4_ = fVar180 * fVar180 * fVar180 * auVar14._12_4_ * -0.5;
            auVar70._16_4_ = fVar181 * fVar181 * fVar181 * -0.0;
            auVar70._20_4_ = fVar191 * fVar191 * fVar191 * -0.0;
            auVar70._24_4_ = fVar192 * fVar192 * fVar192 * -0.0;
            auVar70._28_4_ = 0;
            auVar154._8_4_ = 0x3fc00000;
            auVar154._0_8_ = 0x3fc000003fc00000;
            auVar154._12_4_ = 0x3fc00000;
            auVar154._16_4_ = 0x3fc00000;
            auVar154._20_4_ = 0x3fc00000;
            auVar154._24_4_ = 0x3fc00000;
            auVar154._28_4_ = 0x3fc00000;
            auVar14 = vfmadd231ps_fma(auVar70,auVar154,auVar153);
            fVar188 = auVar14._0_4_;
            fVar175 = auVar14._4_4_;
            auVar71._4_4_ = auVar129._4_4_ * fVar175;
            auVar71._0_4_ = auVar129._0_4_ * fVar188;
            fVar179 = auVar14._8_4_;
            auVar71._8_4_ = auVar129._8_4_ * fVar179;
            fVar180 = auVar14._12_4_;
            auVar71._12_4_ = auVar129._12_4_ * fVar180;
            auVar71._16_4_ = auVar129._16_4_ * 0.0;
            auVar71._20_4_ = auVar129._20_4_ * 0.0;
            auVar71._24_4_ = auVar129._24_4_ * 0.0;
            auVar71._28_4_ = auVar129._28_4_;
            auVar72._4_4_ = fVar175 * -auVar163._4_4_;
            auVar72._0_4_ = fVar188 * -auVar163._0_4_;
            auVar72._8_4_ = fVar179 * -auVar163._8_4_;
            auVar72._12_4_ = fVar180 * -auVar163._12_4_;
            auVar72._16_4_ = -auVar163._16_4_ * 0.0;
            auVar72._20_4_ = -auVar163._20_4_ * 0.0;
            auVar72._24_4_ = -auVar163._24_4_ * 0.0;
            auVar72._28_4_ = auVar153._28_4_;
            auVar14 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar173,auVar173);
            auVar153 = vrsqrtps_avx(ZEXT1632(auVar14));
            auVar73._28_4_ = auVar141._28_4_;
            auVar73._0_28_ =
                 ZEXT1628(CONCAT412(fVar180 * 0.0,
                                    CONCAT48(fVar179 * 0.0,CONCAT44(fVar175 * 0.0,fVar188 * 0.0))));
            fVar188 = auVar153._0_4_;
            fVar175 = auVar153._4_4_;
            fVar179 = auVar153._8_4_;
            fVar180 = auVar153._12_4_;
            fVar181 = auVar153._16_4_;
            fVar191 = auVar153._20_4_;
            fVar192 = auVar153._24_4_;
            auVar74._4_4_ = fVar175 * fVar175 * fVar175 * auVar14._4_4_ * -0.5;
            auVar74._0_4_ = fVar188 * fVar188 * fVar188 * auVar14._0_4_ * -0.5;
            auVar74._8_4_ = fVar179 * fVar179 * fVar179 * auVar14._8_4_ * -0.5;
            auVar74._12_4_ = fVar180 * fVar180 * fVar180 * auVar14._12_4_ * -0.5;
            auVar74._16_4_ = fVar181 * fVar181 * fVar181 * -0.0;
            auVar74._20_4_ = fVar191 * fVar191 * fVar191 * -0.0;
            auVar74._24_4_ = fVar192 * fVar192 * fVar192 * -0.0;
            auVar74._28_4_ = 0;
            auVar14 = vfmadd231ps_fma(auVar74,auVar154,auVar153);
            fVar188 = auVar14._0_4_;
            fVar175 = auVar14._4_4_;
            auVar153._4_4_ = auVar173._4_4_ * fVar175;
            auVar153._0_4_ = auVar173._0_4_ * fVar188;
            fVar179 = auVar14._8_4_;
            auVar153._8_4_ = auVar173._8_4_ * fVar179;
            fVar180 = auVar14._12_4_;
            auVar153._12_4_ = auVar173._12_4_ * fVar180;
            auVar153._16_4_ = auVar173._16_4_ * 0.0;
            auVar153._20_4_ = auVar173._20_4_ * 0.0;
            auVar153._24_4_ = auVar173._24_4_ * 0.0;
            auVar153._28_4_ = 0;
            auVar75._4_4_ = fVar175 * -auVar115._4_4_;
            auVar75._0_4_ = fVar188 * -auVar115._0_4_;
            auVar75._8_4_ = fVar179 * -auVar115._8_4_;
            auVar75._12_4_ = fVar180 * -auVar115._12_4_;
            auVar75._16_4_ = -auVar115._16_4_ * 0.0;
            auVar75._20_4_ = -auVar115._20_4_ * 0.0;
            auVar75._24_4_ = -auVar115._24_4_ * 0.0;
            auVar75._28_4_ = 0;
            auVar76._28_4_ = 0xbf000000;
            auVar76._0_28_ =
                 ZEXT1628(CONCAT412(fVar180 * 0.0,
                                    CONCAT48(fVar179 * 0.0,CONCAT44(fVar175 * 0.0,fVar188 * 0.0))));
            auVar14 = vfmadd213ps_fma(auVar71,ZEXT1632(auVar21),local_2e0);
            auVar115 = ZEXT1632(auVar21);
            auVar15 = vfmadd213ps_fma(auVar72,auVar115,local_440);
            auVar16 = vfmadd213ps_fma(auVar73,auVar115,ZEXT1632(auVar13));
            auVar24 = vfnmadd213ps_fma(auVar71,auVar115,local_2e0);
            auVar17 = vfmadd213ps_fma(auVar153,ZEXT1632(auVar10),local_2c0);
            auVar25 = vfnmadd213ps_fma(auVar72,auVar115,local_440);
            auVar115 = ZEXT1632(auVar10);
            auVar107 = vfmadd213ps_fma(auVar75,auVar115,auVar131);
            local_780 = ZEXT1632(auVar21);
            auVar155 = vfnmadd231ps_fma(ZEXT1632(auVar13),local_780,auVar73);
            auVar13 = vfmadd213ps_fma(auVar76,auVar115,ZEXT1632(auVar11));
            auVar26 = vfnmadd213ps_fma(auVar153,auVar115,local_2c0);
            auVar145 = vfnmadd213ps_fma(auVar75,auVar115,auVar131);
            auVar156 = vfnmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar10),auVar76);
            auVar153 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar25));
            auVar115 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar155));
            auVar166._0_4_ = auVar153._0_4_ * auVar155._0_4_;
            auVar166._4_4_ = auVar153._4_4_ * auVar155._4_4_;
            auVar166._8_4_ = auVar153._8_4_ * auVar155._8_4_;
            auVar166._12_4_ = auVar153._12_4_ * auVar155._12_4_;
            auVar166._16_4_ = auVar153._16_4_ * 0.0;
            auVar166._20_4_ = auVar153._20_4_ * 0.0;
            auVar166._24_4_ = auVar153._24_4_ * 0.0;
            auVar166._28_4_ = 0;
            auVar169 = vfmsub231ps_fma(auVar166,ZEXT1632(auVar25),auVar115);
            auVar77._4_4_ = auVar24._4_4_ * auVar115._4_4_;
            auVar77._0_4_ = auVar24._0_4_ * auVar115._0_4_;
            auVar77._8_4_ = auVar24._8_4_ * auVar115._8_4_;
            auVar77._12_4_ = auVar24._12_4_ * auVar115._12_4_;
            auVar77._16_4_ = auVar115._16_4_ * 0.0;
            auVar77._20_4_ = auVar115._20_4_ * 0.0;
            auVar77._24_4_ = auVar115._24_4_ * 0.0;
            auVar77._28_4_ = auVar115._28_4_;
            auVar186 = ZEXT1632(auVar24);
            auVar115 = vsubps_avx(ZEXT1632(auVar17),auVar186);
            auVar117 = ZEXT1632(auVar155);
            auVar11 = vfmsub231ps_fma(auVar77,auVar117,auVar115);
            auVar78._4_4_ = auVar25._4_4_ * auVar115._4_4_;
            auVar78._0_4_ = auVar25._0_4_ * auVar115._0_4_;
            auVar78._8_4_ = auVar25._8_4_ * auVar115._8_4_;
            auVar78._12_4_ = auVar25._12_4_ * auVar115._12_4_;
            auVar78._16_4_ = auVar115._16_4_ * 0.0;
            auVar78._20_4_ = auVar115._20_4_ * 0.0;
            auVar78._24_4_ = auVar115._24_4_ * 0.0;
            auVar78._28_4_ = auVar115._28_4_;
            auVar24 = vfmsub231ps_fma(auVar78,auVar186,auVar153);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar24),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar169));
            auVar176 = vcmpps_avx(ZEXT1632(auVar11),ZEXT832(0) << 0x20,2);
            auVar153 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar14),auVar176);
            local_5a0 = vblendvps_avx(ZEXT1632(auVar145),ZEXT1632(auVar15),auVar176);
            auVar115 = vblendvps_avx(ZEXT1632(auVar156),ZEXT1632(auVar16),auVar176);
            auVar173 = vblendvps_avx(auVar186,ZEXT1632(auVar17),auVar176);
            auVar163 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar107),auVar176);
            auVar129 = vblendvps_avx(auVar117,ZEXT1632(auVar13),auVar176);
            auVar186 = vblendvps_avx(ZEXT1632(auVar17),auVar186,auVar176);
            auVar141 = vblendvps_avx(ZEXT1632(auVar107),ZEXT1632(auVar25),auVar176);
            auVar11 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
            auVar117 = vblendvps_avx(ZEXT1632(auVar13),auVar117,auVar176);
            auVar186 = vsubps_avx(auVar186,auVar153);
            auVar141 = vsubps_avx(auVar141,local_5a0);
            auVar131 = vsubps_avx(auVar117,auVar115);
            auVar148 = vsubps_avx(auVar153,auVar173);
            auVar124 = vsubps_avx(local_5a0,auVar163);
            auVar140 = vsubps_avx(auVar115,auVar129);
            auVar160._0_4_ = auVar131._0_4_ * auVar153._0_4_;
            auVar160._4_4_ = auVar131._4_4_ * auVar153._4_4_;
            auVar160._8_4_ = auVar131._8_4_ * auVar153._8_4_;
            auVar160._12_4_ = auVar131._12_4_ * auVar153._12_4_;
            auVar160._16_4_ = auVar131._16_4_ * auVar153._16_4_;
            auVar160._20_4_ = auVar131._20_4_ * auVar153._20_4_;
            auVar160._24_4_ = auVar131._24_4_ * auVar153._24_4_;
            auVar160._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar160,auVar115,auVar186);
            auVar79._4_4_ = auVar186._4_4_ * local_5a0._4_4_;
            auVar79._0_4_ = auVar186._0_4_ * local_5a0._0_4_;
            auVar79._8_4_ = auVar186._8_4_ * local_5a0._8_4_;
            auVar79._12_4_ = auVar186._12_4_ * local_5a0._12_4_;
            auVar79._16_4_ = auVar186._16_4_ * local_5a0._16_4_;
            auVar79._20_4_ = auVar186._20_4_ * local_5a0._20_4_;
            auVar79._24_4_ = auVar186._24_4_ * local_5a0._24_4_;
            auVar79._28_4_ = auVar117._28_4_;
            auVar14 = vfmsub231ps_fma(auVar79,auVar153,auVar141);
            auVar199 = ZEXT864(0) << 0x20;
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar161._0_4_ = auVar141._0_4_ * auVar115._0_4_;
            auVar161._4_4_ = auVar141._4_4_ * auVar115._4_4_;
            auVar161._8_4_ = auVar141._8_4_ * auVar115._8_4_;
            auVar161._12_4_ = auVar141._12_4_ * auVar115._12_4_;
            auVar161._16_4_ = auVar141._16_4_ * auVar115._16_4_;
            auVar161._20_4_ = auVar141._20_4_ * auVar115._20_4_;
            auVar161._24_4_ = auVar141._24_4_ * auVar115._24_4_;
            auVar161._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar161,local_5a0,auVar131);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar162._0_4_ = auVar140._0_4_ * auVar173._0_4_;
            auVar162._4_4_ = auVar140._4_4_ * auVar173._4_4_;
            auVar162._8_4_ = auVar140._8_4_ * auVar173._8_4_;
            auVar162._12_4_ = auVar140._12_4_ * auVar173._12_4_;
            auVar162._16_4_ = auVar140._16_4_ * auVar173._16_4_;
            auVar162._20_4_ = auVar140._20_4_ * auVar173._20_4_;
            auVar162._24_4_ = auVar140._24_4_ * auVar173._24_4_;
            auVar162._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar162,auVar148,auVar129);
            auVar80._4_4_ = auVar124._4_4_ * auVar129._4_4_;
            auVar80._0_4_ = auVar124._0_4_ * auVar129._0_4_;
            auVar80._8_4_ = auVar124._8_4_ * auVar129._8_4_;
            auVar80._12_4_ = auVar124._12_4_ * auVar129._12_4_;
            auVar80._16_4_ = auVar124._16_4_ * auVar129._16_4_;
            auVar80._20_4_ = auVar124._20_4_ * auVar129._20_4_;
            auVar80._24_4_ = auVar124._24_4_ * auVar129._24_4_;
            auVar80._28_4_ = auVar129._28_4_;
            auVar15 = vfmsub231ps_fma(auVar80,auVar163,auVar140);
            auVar81._4_4_ = auVar148._4_4_ * auVar163._4_4_;
            auVar81._0_4_ = auVar148._0_4_ * auVar163._0_4_;
            auVar81._8_4_ = auVar148._8_4_ * auVar163._8_4_;
            auVar81._12_4_ = auVar148._12_4_ * auVar163._12_4_;
            auVar81._16_4_ = auVar148._16_4_ * auVar163._16_4_;
            auVar81._20_4_ = auVar148._20_4_ * auVar163._20_4_;
            auVar81._24_4_ = auVar148._24_4_ * auVar163._24_4_;
            auVar81._28_4_ = auVar163._28_4_;
            auVar16 = vfmsub231ps_fma(auVar81,auVar124,auVar173);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar173 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
            auVar173 = vcmpps_avx(auVar173,ZEXT832(0) << 0x20,2);
            auVar13 = vpackssdw_avx(auVar173._0_16_,auVar173._16_16_);
            auVar13 = vpand_avx(auVar13,auVar11);
            auVar173 = vpmovsxwd_avx2(auVar13);
            auVar164 = ZEXT3264(auVar173);
            if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar173 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar173 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar173 >> 0x7f,0) == '\0') &&
                  (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar173 >> 0xbf,0) == '\0') &&
                (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar173[0x1f]) {
LAB_01818ca1:
              auVar150._8_8_ = uStack_478;
              auVar150._0_8_ = local_480;
              auVar150._16_8_ = uStack_470;
              auVar150._24_8_ = uStack_468;
              auVar190 = ZEXT3264(auVar109);
            }
            else {
              auVar82._4_4_ = auVar141._4_4_ * auVar140._4_4_;
              auVar82._0_4_ = auVar141._0_4_ * auVar140._0_4_;
              auVar82._8_4_ = auVar141._8_4_ * auVar140._8_4_;
              auVar82._12_4_ = auVar141._12_4_ * auVar140._12_4_;
              auVar82._16_4_ = auVar141._16_4_ * auVar140._16_4_;
              auVar82._20_4_ = auVar141._20_4_ * auVar140._20_4_;
              auVar82._24_4_ = auVar141._24_4_ * auVar140._24_4_;
              auVar82._28_4_ = auVar173._28_4_;
              auVar169 = vfmsub231ps_fma(auVar82,auVar124,auVar131);
              auVar167._0_4_ = auVar148._0_4_ * auVar131._0_4_;
              auVar167._4_4_ = auVar148._4_4_ * auVar131._4_4_;
              auVar167._8_4_ = auVar148._8_4_ * auVar131._8_4_;
              auVar167._12_4_ = auVar148._12_4_ * auVar131._12_4_;
              auVar167._16_4_ = auVar148._16_4_ * auVar131._16_4_;
              auVar167._20_4_ = auVar148._20_4_ * auVar131._20_4_;
              auVar167._24_4_ = auVar148._24_4_ * auVar131._24_4_;
              auVar167._28_4_ = 0;
              auVar107 = vfmsub231ps_fma(auVar167,auVar186,auVar140);
              auVar83._4_4_ = auVar186._4_4_ * auVar124._4_4_;
              auVar83._0_4_ = auVar186._0_4_ * auVar124._0_4_;
              auVar83._8_4_ = auVar186._8_4_ * auVar124._8_4_;
              auVar83._12_4_ = auVar186._12_4_ * auVar124._12_4_;
              auVar83._16_4_ = auVar186._16_4_ * auVar124._16_4_;
              auVar83._20_4_ = auVar186._20_4_ * auVar124._20_4_;
              auVar83._24_4_ = auVar186._24_4_ * auVar124._24_4_;
              auVar83._28_4_ = auVar124._28_4_;
              auVar24 = vfmsub231ps_fma(auVar83,auVar148,auVar141);
              auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar107),ZEXT1632(auVar24));
              auVar17 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar169),ZEXT832(0) << 0x20);
              auVar173 = vrcpps_avx(ZEXT1632(auVar17));
              auVar198._8_4_ = 0x3f800000;
              auVar198._0_8_ = 0x3f8000003f800000;
              auVar198._12_4_ = 0x3f800000;
              auVar198._16_4_ = 0x3f800000;
              auVar198._20_4_ = 0x3f800000;
              auVar198._24_4_ = 0x3f800000;
              auVar198._28_4_ = 0x3f800000;
              auVar199 = ZEXT3264(auVar198);
              auVar16 = vfnmadd213ps_fma(auVar173,ZEXT1632(auVar17),auVar198);
              auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar173,auVar173);
              auVar84._4_4_ = auVar24._4_4_ * auVar115._4_4_;
              auVar84._0_4_ = auVar24._0_4_ * auVar115._0_4_;
              auVar84._8_4_ = auVar24._8_4_ * auVar115._8_4_;
              auVar84._12_4_ = auVar24._12_4_ * auVar115._12_4_;
              auVar84._16_4_ = auVar115._16_4_ * 0.0;
              auVar84._20_4_ = auVar115._20_4_ * 0.0;
              auVar84._24_4_ = auVar115._24_4_ * 0.0;
              auVar84._28_4_ = auVar115._28_4_;
              auVar107 = vfmadd231ps_fma(auVar84,ZEXT1632(auVar107),local_5a0);
              auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar169),auVar153);
              fVar175 = auVar16._0_4_;
              fVar179 = auVar16._4_4_;
              fVar180 = auVar16._8_4_;
              fVar181 = auVar16._12_4_;
              auVar163 = ZEXT1632(CONCAT412(fVar181 * auVar107._12_4_,
                                            CONCAT48(fVar180 * auVar107._8_4_,
                                                     CONCAT44(fVar179 * auVar107._4_4_,
                                                              fVar175 * auVar107._0_4_))));
              auVar164 = ZEXT3264(auVar163);
              fVar188 = ray->tfar;
              auVar149._4_4_ = fVar188;
              auVar149._0_4_ = fVar188;
              auVar149._8_4_ = fVar188;
              auVar149._12_4_ = fVar188;
              auVar149._16_4_ = fVar188;
              auVar149._20_4_ = fVar188;
              auVar149._24_4_ = fVar188;
              auVar149._28_4_ = fVar188;
              auVar96._8_8_ = uStack_118;
              auVar96._0_8_ = local_120;
              auVar96._16_8_ = uStack_110;
              auVar96._24_8_ = uStack_108;
              auVar115 = vcmpps_avx(auVar96,auVar163,2);
              auVar173 = vcmpps_avx(auVar163,auVar149,2);
              auVar115 = vandps_avx(auVar173,auVar115);
              auVar16 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
              auVar13 = vpand_avx(auVar13,auVar16);
              auVar115 = vpmovsxwd_avx2(auVar13);
              if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar115 >> 0x7f,0) == '\0') &&
                    (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar115 >> 0xbf,0) == '\0') &&
                  (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar115[0x1f]) goto LAB_01818ca1;
              auVar115 = vcmpps_avx(ZEXT1632(auVar17),ZEXT832(0) << 0x20,4);
              auVar16 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
              auVar13 = vpand_avx(auVar13,auVar16);
              auVar115 = vpmovsxwd_avx2(auVar13);
              auVar150._8_8_ = uStack_478;
              auVar150._0_8_ = local_480;
              auVar150._16_8_ = uStack_470;
              auVar150._24_8_ = uStack_468;
              auVar190 = ZEXT3264(auVar109);
              if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar115 >> 0x7f,0) != '\0') ||
                    (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar115 >> 0xbf,0) != '\0') ||
                  (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar115[0x1f] < '\0') {
                auVar129 = ZEXT1632(CONCAT412(fVar181 * auVar14._12_4_,
                                              CONCAT48(fVar180 * auVar14._8_4_,
                                                       CONCAT44(fVar179 * auVar14._4_4_,
                                                                fVar175 * auVar14._0_4_))));
                auVar85._28_4_ = SUB84(uStack_468,4);
                auVar85._0_28_ =
                     ZEXT1628(CONCAT412(fVar181 * auVar15._12_4_,
                                        CONCAT48(fVar180 * auVar15._8_4_,
                                                 CONCAT44(fVar179 * auVar15._4_4_,
                                                          fVar175 * auVar15._0_4_))));
                auVar177._8_4_ = 0x3f800000;
                auVar177._0_8_ = 0x3f8000003f800000;
                auVar177._12_4_ = 0x3f800000;
                auVar177._16_4_ = 0x3f800000;
                auVar177._20_4_ = 0x3f800000;
                auVar177._24_4_ = 0x3f800000;
                auVar177._28_4_ = 0x3f800000;
                auVar173 = vsubps_avx(auVar177,auVar129);
                local_740 = vblendvps_avx(auVar173,auVar129,auVar176);
                auVar173 = vsubps_avx(auVar177,auVar85);
                local_3c0 = vblendvps_avx(auVar173,auVar85,auVar176);
                auVar190 = ZEXT3264(auVar163);
                auVar150 = auVar115;
              }
            }
            auVar210 = ZEXT3264(local_6e0);
            auVar206 = ZEXT3264(local_6c0);
            auVar196 = ZEXT3264(local_680);
            auVar187 = ZEXT3264(local_720);
            if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar150 >> 0x7f,0) == '\0') &&
                  (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar150 >> 0xbf,0) == '\0') &&
                (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar150[0x1f]) goto LAB_018187fe;
            auVar115 = vsubps_avx(ZEXT1632(auVar10),local_780);
            auVar10 = vfmadd213ps_fma(auVar115,local_740,local_780);
            fVar188 = local_688->depth_scale;
            auVar86._4_4_ = (auVar10._4_4_ + auVar10._4_4_) * fVar188;
            auVar86._0_4_ = (auVar10._0_4_ + auVar10._0_4_) * fVar188;
            auVar86._8_4_ = (auVar10._8_4_ + auVar10._8_4_) * fVar188;
            auVar86._12_4_ = (auVar10._12_4_ + auVar10._12_4_) * fVar188;
            auVar86._16_4_ = fVar188 * 0.0;
            auVar86._20_4_ = fVar188 * 0.0;
            auVar86._24_4_ = fVar188 * 0.0;
            auVar86._28_4_ = fVar188;
            local_220 = auVar190._0_32_;
            auVar115 = vcmpps_avx(local_220,auVar86,6);
            auVar173 = auVar150 & auVar115;
            auVar168 = ZEXT3264(local_620);
            auVar174 = ZEXT3264(CONCAT428(fStack_624,
                                          CONCAT424(fStack_628,
                                                    CONCAT420(fStack_62c,
                                                              CONCAT416(fStack_630,
                                                                        CONCAT412(fStack_634,
                                                                                  CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
            auVar178 = ZEXT3264(local_660);
            if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar173 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar173 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar173 >> 0x7f,0) == '\0') &&
                  (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar173 >> 0xbf,0) == '\0') &&
                (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar173[0x1f]) {
              auVar134 = ZEXT3264(local_740);
            }
            else {
              auVar133._8_4_ = 0xbf800000;
              auVar133._0_8_ = 0xbf800000bf800000;
              auVar133._12_4_ = 0xbf800000;
              auVar133._16_4_ = 0xbf800000;
              auVar133._20_4_ = 0xbf800000;
              auVar133._24_4_ = 0xbf800000;
              auVar133._28_4_ = 0xbf800000;
              auVar144._8_4_ = 0x40000000;
              auVar144._0_8_ = 0x4000000040000000;
              auVar144._12_4_ = 0x40000000;
              auVar144._16_4_ = 0x40000000;
              auVar144._20_4_ = 0x40000000;
              auVar144._24_4_ = 0x40000000;
              auVar144._28_4_ = 0x40000000;
              auVar10 = vfmadd213ps_fma(local_3c0,auVar144,auVar133);
              auVar164 = ZEXT1664(auVar10);
              local_260 = local_740;
              local_240 = ZEXT1632(auVar10);
              local_1fc = iVar19;
              local_1f0 = local_5e0;
              uStack_1e8 = uStack_5d8;
              local_1e0 = local_5f0;
              uStack_1d8 = uStack_5e8;
              local_1d0 = local_600;
              uStack_1c8 = uStack_5f8;
              pGVar100 = (context->scene->geometries).items[local_690].ptr;
              auVar134 = ZEXT3264(local_740);
              local_3c0 = ZEXT1632(auVar10);
              auVar173 = local_3c0;
              if ((pGVar100->mask & ray->mask) == 0) {
                bVar97 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar97 = 1, pGVar100->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_5a0._0_8_ = pGVar100;
                local_7a0 = ZEXT1632(CONCAT88(auVar11._8_8_,context));
                auVar115 = vandps_avx(auVar115,auVar150);
                fVar135 = (float)local_200;
                local_180[0] = (fVar135 + local_740._0_4_ + 0.0) * (float)local_400._0_4_;
                local_180[1] = (fVar135 + local_740._4_4_ + 1.0) * (float)local_400._4_4_;
                local_180[2] = (fVar135 + local_740._8_4_ + 2.0) * fStack_3f8;
                local_180[3] = (fVar135 + local_740._12_4_ + 3.0) * fStack_3f4;
                fStack_170 = (fVar135 + local_740._16_4_ + 4.0) * fStack_3f0;
                fStack_16c = (fVar135 + local_740._20_4_ + 5.0) * fStack_3ec;
                fStack_168 = (fVar135 + local_740._24_4_ + 6.0) * fStack_3e8;
                fStack_164 = fVar135 + local_740._28_4_ + 7.0;
                local_3c0._0_8_ = auVar10._0_8_;
                local_3c0._8_8_ = auVar10._8_8_;
                local_160 = local_3c0._0_8_;
                uStack_158 = local_3c0._8_8_;
                uStack_150 = 0;
                uStack_148 = 0;
                local_700 = local_220;
                local_140 = local_220;
                uVar98 = vmovmskps_avx(auVar115);
                local_3c0 = auVar173;
                if (uVar98 == 0) {
                  bVar97 = 0;
LAB_01818ce8:
                  auVar196 = ZEXT3264(local_680);
                  auVar134 = ZEXT3264(local_740);
                  auVar187 = ZEXT3264(local_720);
                  auVar190 = ZEXT3264(local_700);
                  auVar206 = ZEXT3264(local_6c0);
                  auVar210 = ZEXT3264(local_6e0);
                  auVar168 = ZEXT3264(local_620);
                  auVar174 = ZEXT3264(CONCAT428(fStack_624,
                                                CONCAT424(fStack_628,
                                                          CONCAT420(fStack_62c,
                                                                    CONCAT416(fStack_630,
                                                                              CONCAT412(fStack_634,
                                                                                        CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                  auVar178 = ZEXT3264(local_660);
                  fVar135 = (float)local_560;
                  fVar118 = local_560._4_4_;
                  fVar119 = (float)uStack_558;
                  fVar120 = uStack_558._4_4_;
                  fVar121 = (float)uStack_550;
                  fVar122 = uStack_550._4_4_;
                  fVar123 = (float)uStack_548;
                  uVar105 = uStack_548._4_4_;
                }
                else {
                  uVar99 = CONCAT44(0,uVar98 & 0xff);
                  local_760._8_24_ = auVar153._8_24_;
                  local_760._0_8_ = uVar99;
                  lVar23 = 0;
                  for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
                    lVar23 = lVar23 + 1;
                  }
                  local_780 = ZEXT1632(CONCAT88(auVar21._8_8_,lVar23));
                  local_4c0._0_32_ = ZEXT1632(CONCAT124(auVar12._4_12_,ray->tfar));
                  do {
                    local_534 = local_180[local_780._0_8_];
                    local_530 = *(undefined4 *)((long)&local_160 + local_780._0_8_ * 4);
                    ray->tfar = *(float *)(local_140 + local_780._0_8_ * 4);
                    local_5d0.context = context->user;
                    fVar118 = 1.0 - local_534;
                    fVar135 = fVar118 * fVar118 * -3.0;
                    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar118 * fVar118)),
                                              ZEXT416((uint)(local_534 * fVar118)),
                                              ZEXT416(0xc0000000));
                    auVar10 = vfmsub132ss_fma(ZEXT416((uint)(local_534 * fVar118)),
                                              ZEXT416((uint)(local_534 * local_534)),
                                              ZEXT416(0x40000000));
                    fVar118 = auVar21._0_4_ * 3.0;
                    fVar119 = auVar10._0_4_ * 3.0;
                    fVar120 = local_534 * local_534 * 3.0;
                    auVar158._0_4_ = fVar120 * local_490;
                    auVar158._4_4_ = fVar120 * fStack_48c;
                    auVar158._8_4_ = fVar120 * fStack_488;
                    auVar158._12_4_ = fVar120 * fStack_484;
                    auVar164 = ZEXT1664(auVar158);
                    auVar138._4_4_ = fVar119;
                    auVar138._0_4_ = fVar119;
                    auVar138._8_4_ = fVar119;
                    auVar138._12_4_ = fVar119;
                    auVar91._8_8_ = uStack_5f8;
                    auVar91._0_8_ = local_600;
                    auVar21 = vfmadd132ps_fma(auVar138,auVar158,auVar91);
                    auVar147._4_4_ = fVar118;
                    auVar147._0_4_ = fVar118;
                    auVar147._8_4_ = fVar118;
                    auVar147._12_4_ = fVar118;
                    auVar93._8_8_ = uStack_5e8;
                    auVar93._0_8_ = local_5f0;
                    auVar21 = vfmadd132ps_fma(auVar147,auVar21,auVar93);
                    auVar139._4_4_ = fVar135;
                    auVar139._0_4_ = fVar135;
                    auVar139._8_4_ = fVar135;
                    auVar139._12_4_ = fVar135;
                    auVar95._8_8_ = uStack_5d8;
                    auVar95._0_8_ = local_5e0;
                    auVar21 = vfmadd132ps_fma(auVar139,auVar21,auVar95);
                    local_540 = vmovlps_avx(auVar21);
                    local_538 = vextractps_avx(auVar21,2);
                    local_52c = (int)local_508;
                    local_528 = (int)local_690;
                    local_524 = (local_5d0.context)->instID[0];
                    local_520 = (local_5d0.context)->instPrimID[0];
                    local_7ac = -1;
                    local_5d0.valid = &local_7ac;
                    local_5d0.geometryUserPtr = pGVar100->userPtr;
                    local_5d0.ray = (RTCRayN *)ray;
                    local_5d0.hit = (RTCHitN *)&local_540;
                    local_5d0.N = 1;
                    if (pGVar100->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01818b8f:
                      p_Var20 = (*(RTCIntersectArguments **)(local_7a0._0_8_ + 0x10))->filter;
                      if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                         ((((*(RTCIntersectArguments **)(local_7a0._0_8_ + 0x10))->flags &
                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_5a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar164 = ZEXT1664(auVar164._0_16_);
                        auVar199 = ZEXT1664(auVar199._0_16_);
                        (*p_Var20)(&local_5d0);
                        if (*local_5d0.valid == 0) goto LAB_01818bda;
                      }
                      bVar97 = 1;
                      goto LAB_01818ce8;
                    }
                    auVar164 = ZEXT1664(auVar158);
                    auVar199 = ZEXT1664(auVar199._0_16_);
                    (*pGVar100->occlusionFilterN)(&local_5d0);
                    if (*local_5d0.valid != 0) goto LAB_01818b8f;
LAB_01818bda:
                    ray->tfar = (float)local_4c0._0_4_;
                    uVar102 = local_760._0_8_ ^ 1L << (local_780._0_8_ & 0x3f);
                    bVar97 = 0;
                    local_760._0_8_ = uVar102;
                    lVar23 = 0;
                    for (uVar99 = uVar102; (uVar99 & 1) == 0;
                        uVar99 = uVar99 >> 1 | 0x8000000000000000) {
                      lVar23 = lVar23 + 1;
                    }
                    local_780._0_8_ = lVar23;
                    auVar196 = ZEXT3264(local_680);
                    auVar134 = ZEXT3264(local_740);
                    auVar187 = ZEXT3264(local_720);
                    auVar190 = ZEXT3264(local_700);
                    auVar206 = ZEXT3264(local_6c0);
                    auVar210 = ZEXT3264(local_6e0);
                    auVar168 = ZEXT3264(local_620);
                    auVar174 = ZEXT3264(CONCAT428(fStack_624,
                                                  CONCAT424(fStack_628,
                                                            CONCAT420(fStack_62c,
                                                                      CONCAT416(fStack_630,
                                                                                CONCAT412(fStack_634
                                                                                          ,CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                    auVar178 = ZEXT3264(local_660);
                    pGVar100 = (Geometry *)local_5a0._0_8_;
                    context = (RayQueryContext *)local_7a0._0_8_;
                    fVar135 = (float)local_560;
                    fVar118 = local_560._4_4_;
                    fVar119 = (float)uStack_558;
                    fVar120 = uStack_558._4_4_;
                    fVar121 = (float)uStack_550;
                    fVar122 = uStack_550._4_4_;
                    fVar123 = (float)uStack_548;
                    uVar105 = uStack_548._4_4_;
                  } while (uVar102 != 0);
                }
              }
              bVar103 = (bool)(bVar103 | bVar97);
            }
          }
          local_740 = auVar134._0_32_;
          lVar101 = lVar101 + 8;
          auVar151 = ZEXT3264(local_4e0);
          context = (RayQueryContext *)local_7a0._0_8_;
        } while ((int)lVar101 < iVar19);
      }
      if (bVar103) {
        return bVar103;
      }
      fVar135 = ray->tfar;
      auVar116._4_4_ = fVar135;
      auVar116._0_4_ = fVar135;
      auVar116._8_4_ = fVar135;
      auVar116._12_4_ = fVar135;
      auVar116._16_4_ = fVar135;
      auVar116._20_4_ = fVar135;
      auVar116._24_4_ = fVar135;
      auVar116._28_4_ = fVar135;
      auVar153 = vcmpps_avx(local_80,auVar116,2);
      uVar98 = vmovmskps_avx(auVar153);
      uVar98 = (uint)uVar104 & uVar98;
      context = (RayQueryContext *)local_7a0._0_8_;
    } while (uVar98 != 0);
  }
  return bVar103;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }